

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  undefined4 uVar1;
  stbtt__point sVar2;
  stbtt__point sVar3;
  undefined4 uVar4;
  stbtt_uint8 sVar5;
  byte bVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  ImFont *pIVar9;
  ImFontAtlas *pIVar10;
  stbrp_node *data;
  ushort *puVar11;
  ImFontConfig *pIVar12;
  char cVar13;
  char cVar18;
  size_t sz;
  undefined1 auVar26 [16];
  stbtt__buf fontdict;
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  unkuint10 Var29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [16];
  unkbyte10 Var33;
  undefined1 auVar34 [13];
  undefined1 auVar35 [11];
  undefined1 auVar36 [14];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [14];
  undefined1 auVar40 [16];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  uint6 uVar46;
  bool bVar47;
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  stbtt_uint32 sVar51;
  stbtt_uint32 sVar55;
  uint uVar56;
  int iVar57;
  stbtt__active_edge *z;
  long lVar58;
  stbtt_uint32 sVar52;
  stbtt_uint32 sVar53;
  stbtt_uint32 sVar54;
  stbrp_context *psVar59;
  stbrp_node *psVar60;
  ImFontConfig *pIVar61;
  stbrp_node *psVar62;
  void *pvVar63;
  void *pvVar64;
  void *__s;
  uchar *puVar65;
  stbtt__point *ptr;
  stbtt__point *points;
  stbtt__edge *psVar66;
  float *pfVar67;
  stbtt__buf *psVar68;
  stbtt__buf *psVar69;
  undefined8 *puVar70;
  stbtt__buf *psVar71;
  float *pfVar72;
  bool bVar73;
  uint uVar74;
  ulong uVar75;
  int iVar76;
  long lVar77;
  long lVar78;
  undefined8 *puVar79;
  int iVar80;
  uint uVar81;
  undefined1 auVar82 [8];
  bool bVar83;
  uchar uVar84;
  short sVar85;
  stbtt__edge *psVar86;
  ulong uVar87;
  ImWchar *pIVar88;
  ulong uVar89;
  byte *pbVar90;
  stbtt__edge *psVar91;
  long lVar92;
  int iVar93;
  stbrp_node **ppsVar94;
  ulong uVar95;
  long lVar96;
  ulong uVar97;
  size_t sz_00;
  byte *pbVar98;
  short *psVar99;
  stbtt_fontinfo *psVar100;
  stbtt__active_edge *e;
  long lVar101;
  void *p;
  stbtt__buf *psVar102;
  byte bVar103;
  char cVar109;
  float fVar104;
  char cVar107;
  char cVar108;
  undefined1 auVar105 [16];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar118;
  undefined1 in_XMM2 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  undefined1 in_XMM3 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar133;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  uint uVar134;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar135;
  uint uVar141;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  uint uVar142;
  float fVar143;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar144;
  undefined4 uVar145;
  uint uVar153;
  uint uVar155;
  undefined1 auVar150 [16];
  float fVar154;
  float fVar156;
  uint uVar157;
  float fVar158;
  undefined1 auVar151 [16];
  float fVar159;
  uint uVar167;
  uint uVar169;
  undefined1 auVar161 [16];
  float fVar160;
  float fVar168;
  float fVar170;
  uint uVar171;
  float fVar172;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  short sVar173;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar189;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar190 [16];
  stbtt__buf sVar194;
  stbtt_uint32 charstrings;
  float y0_2;
  int x0_1;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 cstype;
  int y0;
  int y0_1;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  uchar *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  int local_47c;
  ulong local_478;
  stbtt_uint32 local_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  ulong local_448;
  stbtt_uint32 local_440;
  stbtt_uint32 local_43c;
  undefined8 local_438;
  float *local_430;
  undefined1 local_428 [16];
  stbrp_node *local_418;
  stbtt_fontinfo *local_410;
  stbtt__point *local_408;
  ulong local_400;
  undefined8 local_3f8;
  stbtt_uint32 local_3f0;
  float local_3ec;
  stbtt__buf local_3e8;
  ulong local_3d8;
  ulong local_3d0;
  uint local_3c4;
  undefined8 *local_3c0;
  stbtt_pack_context local_3b8;
  void *local_380;
  ulong local_378;
  long local_370;
  long local_368;
  long local_360;
  uint local_354;
  uint local_350;
  int local_34c;
  undefined1 local_348 [16];
  void *local_338;
  void *local_330;
  float *local_328;
  long local_320;
  long local_318;
  uchar *local_310;
  float local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  long local_2f8;
  ImFontConfig *local_2f0;
  long local_2e8;
  stbtt__edge *local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  ulong local_2a8;
  short *local_2a0;
  long local_298;
  int local_290;
  int local_28c;
  ulong local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [12];
  int iStack_22c;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 auVar106 [16];
  ushort uVar117;
  undefined6 uVar146;
  undefined8 uVar147;
  undefined1 auVar148 [12];
  undefined1 auVar149 [14];
  undefined1 auVar152 [16];
  undefined4 uVar174;
  undefined6 uVar175;
  undefined8 uVar176;
  undefined1 auVar177 [12];
  undefined1 auVar178 [14];
  undefined1 auVar182 [16];
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                  ,0x690,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  lVar58 = (long)(atlas->ConfigData).Size;
  if (lVar58 < 1) {
    local_430 = (float *)0x0;
    iVar76 = 0x200;
    if (0 < atlas->TexDesiredWidth) {
      iVar76 = atlas->TexDesiredWidth;
    }
    local_438 = (ulong)local_438._4_4_ << 0x20;
  }
  else {
    pIVar61 = (atlas->ConfigData).Data;
    lVar77 = 0;
    local_430 = (float *)0x0;
    iVar80 = 0;
    do {
      pIVar88 = pIVar61[lVar77].GlyphRanges;
      if (pIVar88 == (ushort *)0x0) {
        pIVar61[lVar77].GlyphRanges = ImFontAtlas::GetGlyphRangesDefault::ranges;
        pIVar88 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      uVar48 = *pIVar88;
      while (iVar93 = (int)local_430, uVar48 != 0) {
        if (pIVar88[1] == 0) break;
        local_430 = (float *)(ulong)((iVar93 - (uint)uVar48) + (uint)pIVar88[1] + 1);
        iVar80 = iVar80 + 1;
        uVar48 = pIVar88[2];
        pIVar88 = pIVar88 + 2;
      }
      lVar77 = lVar77 + 1;
    } while (lVar77 != lVar58);
    iVar76 = atlas->TexDesiredWidth;
    if (iVar76 < 1) {
      iVar76 = 0x1000;
      local_438 = CONCAT44(local_438._4_4_,iVar80);
      if ((iVar93 < 0xfa1) && (iVar76 = 0x800, iVar93 < 0x7d1)) {
        iVar76 = (uint)(1000 < iVar93) * 0x200 + 0x200;
      }
    }
    else {
      local_438 = CONCAT44(local_438._4_4_,iVar80);
    }
  }
  atlas->TexWidth = iVar76;
  atlas->TexHeight = 0;
  local_3b8.h_oversample = 0;
  local_3b8.v_oversample = 0;
  uVar56 = atlas->TexGlyphPadding;
  psVar59 = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar81 = iVar76 - uVar56;
  psVar60 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar81 << 4);
  auVar150 = _DAT_001b2370;
  auVar112 = _DAT_001a6460;
  uVar145 = SUB84(psVar59,0);
  iVar80 = (int)((ulong)psVar59 >> 0x20);
  if ((psVar59 == (stbrp_context *)0x0) || (psVar60 == (stbrp_node *)0x0)) {
    if (psVar59 != (stbrp_context *)0x0) {
      ImGui::MemFree(psVar59);
    }
    if (psVar60 != (stbrp_node *)0x0) {
LAB_00184b49:
      ImGui::MemFree(psVar60);
    }
    bVar47 = false;
  }
  else {
    local_3b8.user_allocator_context = (void *)0x0;
    local_3b8.height = 0x8000;
    local_3b8.pixels = (uchar *)0x0;
    local_3b8.pack_info = psVar59;
    local_3b8.width = iVar76;
    local_3b8.stride_in_bytes = iVar76;
    local_3b8.padding = uVar56;
    local_3b8.nodes = psVar60;
    if (((int)uVar56 < -0x7fff) || (0xffff < (int)uVar81)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_rect_pack.h"
                    ,0x100,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar75 = (ulong)(uVar81 - 1);
    if ((int)uVar81 < 2) {
      uVar75 = 0;
      auVar112 = in_XMM2;
    }
    else {
      uVar97 = (ulong)(uVar81 & 0x7ffffffe);
      lVar58 = uVar75 - 1;
      auVar105._8_4_ = (int)lVar58;
      auVar105._0_8_ = lVar58;
      auVar105._12_4_ = (int)((ulong)lVar58 >> 0x20);
      ppsVar94 = &psVar60[1].next;
      auVar105 = auVar105 ^ _DAT_001a6460;
      in_XMM3._8_4_ = 0xffffffff;
      in_XMM3._0_8_ = 0xffffffffffffffff;
      in_XMM3._12_4_ = 0xffffffff;
      auVar161 = _DAT_001a81f0;
      do {
        auVar129 = auVar161 ^ auVar112;
        auVar136._0_4_ = -(uint)(auVar105._0_4_ < auVar129._0_4_);
        auVar136._4_4_ = -(uint)(auVar105._4_4_ < auVar129._4_4_);
        auVar136._8_4_ = -(uint)(auVar105._8_4_ < auVar129._8_4_);
        auVar136._12_4_ = -(uint)(auVar105._12_4_ < auVar129._12_4_);
        auVar130._4_4_ = -(uint)(auVar129._4_4_ == auVar105._4_4_);
        auVar130._12_4_ = -(uint)(auVar129._12_4_ == auVar105._12_4_);
        auVar130._0_4_ = auVar130._4_4_;
        auVar130._8_4_ = auVar130._12_4_;
        auVar129._4_4_ = auVar136._4_4_;
        auVar129._0_4_ = auVar136._4_4_;
        auVar129._8_4_ = auVar136._12_4_;
        auVar129._12_4_ = auVar136._12_4_;
        auVar129 = auVar129 | auVar130 & auVar136;
        lVar58 = auVar161._8_8_;
        if ((~auVar129._0_4_ & 1) != 0) {
          ppsVar94[-2] = psVar60 + auVar161._0_8_ + 1;
        }
        if (((auVar129 ^ in_XMM3) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar94 = psVar60 + (lVar58 - in_XMM3._8_8_);
        }
        auVar161._0_8_ = auVar161._0_8_ + auVar150._0_8_;
        auVar161._8_8_ = lVar58 + auVar150._8_8_;
        ppsVar94 = ppsVar94 + 4;
        uVar97 = uVar97 - 2;
      } while (uVar97 != 0);
    }
    psVar60[uVar75].next = (stbrp_node *)0x0;
    psVar59->init_mode = 1;
    psVar59->heuristic = 0;
    psVar59->free_head = psVar60;
    psVar59->active_head = psVar59->extra;
    psVar59->width = uVar81;
    psVar59->height = 0x8000 - uVar56;
    psVar59->num_nodes = uVar81;
    psVar59->align = (int)((uVar81 - 1) + uVar81) / (int)uVar81;
    psVar59->extra[0].x = 0;
    psVar59->extra[0].y = 0;
    psVar59->extra[0].next = psVar59->extra + 1;
    psVar59->extra[1].x = (stbrp_coord)uVar81;
    psVar59->extra[1].y = 0xffff;
    psVar59->extra[1].next = (stbrp_node *)0x0;
    local_3b8.h_oversample = 1;
    local_3b8.v_oversample = 1;
    ImFontAtlasBuildPackCustomRects(atlas,psVar59);
    local_418 = (stbrp_node *)ImGui::MemAlloc((long)(atlas->ConfigData).Size * 0xc0);
    if (0 < (atlas->ConfigData).Size) {
      lVar58 = 0;
      do {
        psVar60 = local_418;
        pIVar61 = (atlas->ConfigData).Data;
        pIVar9 = pIVar61[lVar58].DstFont;
        if ((pIVar9 == (ImFont *)0x0) ||
           (pIVar10 = pIVar9->ContainerAtlas, pIVar10 != atlas && pIVar10 != (ImFontAtlas *)0x0)) {
          __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                        ,0x6c3,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        pIVar61 = pIVar61 + lVar58;
        data = (stbrp_node *)pIVar61->FontData;
        iVar76 = pIVar61->FontNo;
        bVar103 = (byte)data->x;
        if (bVar103 < 0x4f) {
          if (bVar103 == 0) {
            if (*(stbtt_uint8 *)((long)&data->x + 1) != '\x01') goto LAB_00184c79;
          }
          else if ((bVar103 != 0x31) || (*(stbtt_uint8 *)((long)&data->x + 1) != '\0'))
          goto LAB_00184c79;
          if (((char)data->y != '\0') || (*(char *)((long)&data->y + 1) != '\0')) goto LAB_00184c79;
LAB_001820ea:
          sVar55 = -(uint)(iVar76 != 0);
        }
        else {
          if (bVar103 == 0x4f) {
            if (((*(stbtt_uint8 *)((long)&data->x + 1) != 'T') || ((char)data->y != 'T')) ||
               (*(char *)((long)&data->y + 1) != 'O')) goto LAB_00184c79;
            goto LAB_001820ea;
          }
          if (bVar103 != 0x74) goto LAB_00184c79;
          sVar5 = *(stbtt_uint8 *)((long)&data->x + 1);
          if (sVar5 == 'r') {
            if (((char)data->y != 'u') || (*(char *)((long)&data->y + 1) != 'e')) goto LAB_00184c79;
            goto LAB_001820ea;
          }
          if (sVar5 != 't') {
            if (((sVar5 != 'y') || ((char)data->y != 'p')) || (*(char *)((long)&data->y + 1) != '1')
               ) goto LAB_00184c79;
            goto LAB_001820ea;
          }
          if (((char)data->y != 'c') || (*(char *)((long)&data->y + 1) != 'f')) goto LAB_00184c79;
          uVar56 = *(uint *)&data->field_0x4;
          uVar56 = uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8 |
                   uVar56 << 0x18;
          if (((uVar56 != 0x20000) && (uVar56 != 0x10000)) ||
             (uVar56 = *(uint *)&data->next,
             (int)(uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8 |
                  uVar56 << 0x18) <= iVar76)) goto LAB_00184c79;
          uVar56 = *(uint *)((long)&data->next + (long)iVar76 * 4 + 4);
          sVar55 = uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8 |
                   uVar56 << 0x18;
        }
        if ((int)sVar55 < 0) {
LAB_00184c79:
          __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                        ,0x6c6,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        local_418[lVar58 * 0xc].next = data;
        local_418[lVar58 * 0xc + 1].x = (short)sVar55;
        local_418[lVar58 * 0xc + 1].y = (short)(sVar55 >> 0x10);
        psVar62 = local_418 + lVar58 * 0xc + 4;
        psVar62->x = 0;
        psVar62->y = 0;
        *(undefined4 *)&psVar62->field_0x4 = 0;
        psVar62->next = (stbrp_node *)0x0;
        sVar51 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"cmap");
        sVar52 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"loca");
        local_428._0_4_ = sVar52;
        *(stbtt_uint32 *)&psVar60[lVar58 * 0xc + 1].next = sVar52;
        sVar52 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"head");
        local_458._0_4_ = sVar52;
        *(stbtt_uint32 *)((long)&psVar60[lVar58 * 0xc + 1].next + 4) = sVar52;
        sVar52 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"glyf");
        local_468._0_4_ = sVar52;
        psVar60[lVar58 * 0xc + 2].x = (short)sVar52;
        psVar60[lVar58 * 0xc + 2].y = (short)(sVar52 >> 0x10);
        sVar52 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"hhea");
        *(stbtt_uint32 *)&psVar60[lVar58 * 0xc + 2].field_0x4 = sVar52;
        sVar53 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"hmtx");
        *(stbtt_uint32 *)&psVar60[lVar58 * 0xc + 2].next = sVar53;
        sVar54 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"kern");
        *(stbtt_uint32 *)((long)&psVar60[lVar58 * 0xc + 2].next + 4) = sVar54;
        sVar54 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"GPOS");
        psVar60[lVar58 * 0xc + 3].x = (short)sVar54;
        psVar60[lVar58 * 0xc + 3].y = (short)(sVar54 >> 0x10);
        if ((((sVar51 == 0) || (local_458._0_4_ == 0)) || (sVar52 == 0)) || (sVar53 == 0)) {
LAB_00184b39:
          atlas->TexWidth = 0;
          atlas->TexHeight = 0;
          psVar60 = local_418;
          goto LAB_00184b49;
        }
        if (local_468._0_4_ == 0) {
          local_458 = (undefined1  [8])CONCAT44(0,sVar51);
          local_3f8._0_4_ = 2;
          local_46c = 0;
          local_43c = 0;
          local_440 = 0;
          sVar51 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"CFF ");
          if (sVar51 != 0) {
            psVar62 = psVar60 + lVar58 * 0xc + 9;
            psVar62->x = 0;
            psVar62->y = 0;
            *(undefined4 *)&psVar62->field_0x4 = 0;
            psVar62->next = (stbrp_node *)0x0;
            psVar62 = psVar60 + lVar58 * 0xc + 8;
            psVar62->x = 0;
            psVar62->y = 0;
            *(undefined4 *)&psVar62->field_0x4 = 0;
            psVar62->next = (stbrp_node *)0x0;
            *(stbtt_uint8 **)(psVar60 + lVar58 * 0xc + 4) =
                 (stbtt_uint8 *)((long)&data->x + (ulong)sVar51);
            psVar60[lVar58 * 0xc + 4].next = (stbrp_node *)0x2000000000000000;
            local_238._0_8_ = *(undefined8 *)(psVar60 + lVar58 * 0xc + 4);
            psVar62 = psVar60[lVar58 * 0xc + 4].next;
            local_238._8_4_ = SUB84(psVar62,0);
            if ((int)local_238._8_4_ < -2) goto LAB_00184cd6;
            iStack_22c = (int)((ulong)psVar62 >> 0x20);
            uVar56 = local_238._8_4_ + 2;
            if (iStack_22c < (int)uVar56) goto LAB_00184cd6;
            uVar81 = 0;
            if ((int)uVar56 < iStack_22c) {
              uVar81 = (uint)*(byte *)(local_238._0_8_ + (ulong)uVar56);
            }
            if (iStack_22c < (int)uVar81) goto LAB_00184cd6;
            stack0xfffffffffffffdd0 = (stbrp_node *)CONCAT44(iStack_22c,uVar81);
            stbtt__cff_get_index((stbtt__buf *)local_238);
            sVar194 = stbtt__cff_get_index((stbtt__buf *)local_238);
            local_3e8 = stbtt__cff_index_get(sVar194,0);
            stbtt__cff_get_index((stbtt__buf *)local_238);
            sVar194 = stbtt__cff_get_index((stbtt__buf *)local_238);
            *(stbtt__buf *)(psVar60 + lVar58 * 0xc + 6) = sVar194;
            stbtt__dict_get_ints(&local_3e8,0x11,1,&local_46c);
            stbtt__dict_get_ints(&local_3e8,0x106,1,(stbtt_uint32 *)&local_3f8);
            stbtt__dict_get_ints(&local_3e8,0x124,1,&local_43c);
            stbtt__dict_get_ints(&local_3e8,0x125,1,&local_440);
            psVar62 = stack0xfffffffffffffdd0;
            sVar194.data._4_4_ = in_stack_fffffffffffffb4c;
            sVar194.data._0_4_ = in_stack_fffffffffffffb48;
            sVar194.cursor = uVar145;
            sVar194.size = iVar80;
            fontdict.cursor = (int)in_stack_fffffffffffffb78;
            fontdict.size = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
            fontdict.data = in_stack_fffffffffffffb70;
            sVar194 = stbtt__get_subrs(sVar194,fontdict);
            sVar52 = local_440;
            sVar51 = local_46c;
            *(stbtt__buf *)(psVar60 + lVar58 * 0xc + 7) = sVar194;
            if (((stbtt_uint32)local_3f8 == 2) && (local_46c != 0)) {
              iVar76 = (int)((ulong)psVar62 >> 0x20);
              if (local_43c != 0) {
                uVar75 = (ulong)local_440;
                if (uVar75 == 0) goto LAB_00184b39;
                psVar62 = stack0xfffffffffffffdd0;
                if (((int)local_43c < 0) || (iVar76 < (int)local_43c)) goto LAB_00184cd6;
                stack0xfffffffffffffdd0 = (stbrp_node *)CONCAT44(iStack_22c,local_43c);
                sVar194 = stbtt__cff_get_index((stbtt__buf *)local_238);
                *(stbtt__buf *)(psVar60 + lVar58 * 0xc + 8) = sVar194;
                puVar65 = (uchar *)(local_238._0_8_ + uVar75);
                psVar62 = (stbrp_node *)((ulong)(iStack_22c - sVar52) << 0x20);
                if ((int)(iStack_22c - sVar52 | sVar52) < 0 || iStack_22c < (int)sVar52) {
                  puVar65 = (uchar *)0x0;
                  psVar62 = (stbrp_node *)0x0;
                }
                *(uchar **)(psVar60 + lVar58 * 0xc + 9) = puVar65;
                psVar60[lVar58 * 0xc + 9].next = psVar62;
                iVar76 = iStack_22c;
              }
              psVar62 = stack0xfffffffffffffdd0;
              if (((int)sVar51 < 0) || (iVar76 < (int)sVar51)) {
LAB_00184cd6:
                stack0xfffffffffffffdd0 = psVar62;
                __assert_fail("!(o > b->size || o < 0)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                              ,0x45c,"void stbtt__buf_seek(stbtt__buf *, int)");
              }
              stack0xfffffffffffffdd0 = (stbrp_node *)CONCAT44(iStack_22c,sVar51);
              sVar194 = stbtt__cff_get_index((stbtt__buf *)local_238);
              *(stbtt__buf *)(psVar60 + lVar58 * 0xc + 5) = sVar194;
              auVar82 = local_458;
              goto LAB_001824c5;
            }
          }
          goto LAB_00184b39;
        }
        auVar82 = (undefined1  [8])CONCAT44(0,sVar51);
        if (local_428._0_4_ == 0) goto LAB_00184b39;
LAB_001824c5:
        sVar55 = stbtt__find_table((stbtt_uint8 *)data,sVar55,"maxp");
        if (sVar55 == 0) {
          uVar56 = 0xffff;
        }
        else {
          uVar56 = (uint)(ushort)(*(ushort *)(&data->field_0x4 + sVar55) << 8 |
                                 *(ushort *)(&data->field_0x4 + sVar55) >> 8);
        }
        *(uint *)&psVar60[lVar58 * 0xc + 1].field_0x4 = uVar56;
        uVar48 = *(ushort *)((long)&data->y + ((ulong)auVar82 & 0xffffffff));
        uVar48 = uVar48 << 8 | uVar48 >> 8;
        *(undefined4 *)&psVar60[lVar58 * 0xc + 3].field_0x4 = 0;
        if (uVar48 == 0) goto LAB_00184b39;
        uVar56 = SUB84(auVar82,0) + 4;
        uVar75 = (ulong)uVar48;
        iVar76 = 0;
        do {
          uVar97 = (ulong)uVar56;
          uVar48 = *(ushort *)((long)&data->x + uVar97);
          uVar48 = uVar48 << 8 | uVar48 >> 8;
          if ((uVar48 == 0) ||
             ((uVar48 == 3 &&
              ((uVar48 = *(ushort *)((long)&data->y + uVar97), uVar48 = uVar48 << 8 | uVar48 >> 8,
               uVar48 == 10 || (uVar48 == 1)))))) {
            uVar81 = *(uint *)(&data->field_0x4 + uVar97);
            iVar76 = (uVar81 >> 0x18 | (uVar81 & 0xff0000) >> 8 | (uVar81 & 0xff00) << 8 |
                     uVar81 << 0x18) + SUB84(auVar82,0);
            *(int *)&psVar60[lVar58 * 0xc + 3].field_0x4 = iVar76;
          }
          uVar56 = uVar56 + 8;
          uVar75 = uVar75 - 1;
        } while (uVar75 != 0);
        if (iVar76 == 0) goto LAB_00184b39;
        uVar48 = *(ushort *)
                  ((long)&data[3].y + (long)*(int *)((long)&psVar60[lVar58 * 0xc + 1].next + 4));
        *(uint *)&psVar60[lVar58 * 0xc + 3].next = (uint)(ushort)(uVar48 << 8 | uVar48 >> 8);
        lVar58 = lVar58 + 1;
      } while (lVar58 < (atlas->ConfigData).Size);
    }
    local_478._0_4_ = 0;
    lVar58 = (long)(int)local_430;
    sz = lVar58 * 0x1c;
    pvVar63 = ImGui::MemAlloc(sz);
    sz_00 = lVar58 << 4;
    pvVar64 = ImGui::MemAlloc(sz_00);
    lVar58 = (long)(int)local_438;
    __s = ImGui::MemAlloc(lVar58 * 0x28);
    memset(pvVar63,0,sz);
    local_330 = pvVar64;
    memset(pvVar64,0,sz_00);
    local_380 = __s;
    memset(__s,0,lVar58 * 0x28);
    iVar76 = 0;
    local_47c = 0;
    psVar59 = (stbrp_context *)CONCAT44(iVar80,uVar145);
    local_338 = pvVar63;
    if (0 < (atlas->ConfigData).Size) {
      lVar58 = 0;
      local_47c = 0;
      iVar76 = 0;
      local_478 = 0;
      do {
        uVar75 = local_478;
        pIVar61 = (atlas->ConfigData).Data;
        psVar100 = (stbtt_fontinfo *)(local_418 + lVar58 * 0xc);
        puVar11 = pIVar61[lVar58].GlyphRanges;
        uVar48 = *puVar11;
        if (uVar48 == 0) {
          *(void **)&psVar100[1].fontstart =
               (void *)((long)local_380 + (local_478 & 0xffffffff) * 0x28);
          psVar100[1].loca = 0;
          local_3d0 = 0;
        }
        else {
          uVar97 = 0;
          local_3d0 = 0;
          do {
            if (puVar11[uVar97 * 2 + 1] == 0) {
              *(void **)&psVar100[1].fontstart =
                   (void *)((long)local_380 + (local_478 & 0xffffffff) * 0x28);
              psVar100[1].loca = (int)uVar97;
              local_478 = (local_478 & 0xffffffff) + uVar97;
              if ((int)uVar97 != 0) goto LAB_00182735;
              goto LAB_00182796;
            }
            local_3d0 = (ulong)(((int)local_3d0 - (uint)uVar48) + (uint)puVar11[uVar97 * 2 + 1] + 1)
            ;
            uVar48 = puVar11[uVar97 * 2 + 2];
            uVar97 = uVar97 + 1;
          } while (uVar48 != 0);
          *(void **)&psVar100[1].fontstart =
               (void *)((long)local_380 + (local_478 & 0xffffffff) * 0x28);
          psVar100[1].loca = (int)uVar97;
          local_478 = (ulong)(uint)((int)local_478 + (int)uVar97);
LAB_00182735:
          fVar110 = pIVar61[lVar58].SizePixels;
          pfVar67 = (float *)((long)local_380 + (uVar75 & 0xffffffff) * 0x28);
          uVar75 = 0;
          do {
            *pfVar67 = fVar110;
            uVar48 = puVar11[uVar75 * 2];
            pfVar67[1] = (float)(uint)uVar48;
            iVar80 = (uint)puVar11[uVar75 * 2 + 1] - (uint)uVar48;
            pfVar67[4] = (float)(iVar80 + 1);
            *(void **)(pfVar67 + 6) = (void *)((long)local_47c * 0x1c + (long)local_338);
            local_47c = iVar80 + local_47c + 1;
            uVar75 = uVar75 + 1;
            pfVar67 = pfVar67 + 10;
          } while ((uVar97 & 0xffffffff) != uVar75);
        }
LAB_00182796:
        local_3d8 = CONCAT44(local_3d8._4_4_,iVar76);
        psVar100[1].userdata = (void *)((long)iVar76 * 0x10 + (long)local_330);
        *(int *)&psVar100[1].data = (int)local_3d0;
        local_360 = lVar58;
        stbtt_PackSetOversampling
                  (&local_3b8,pIVar61[lVar58].OversampleH,pIVar61[lVar58].OversampleV);
        uVar147 = local_3b8._32_8_;
        iVar76 = psVar100[1].loca;
        iVar80 = iVar76 >> 0x1f;
        if (iVar76 < 1) {
          iVar93 = 0;
        }
        else {
          uVar75._0_4_ = psVar100[1].fontstart;
          uVar75._4_4_ = psVar100[1].numGlyphs;
          local_3ec = (float)(local_3b8._32_8_ & 0xffffffff);
          local_448 = (ulong)local_3b8._32_8_ >> 0x20;
          local_408 = (stbtt__point *)CONCAT44(local_408._4_4_,(float)local_448);
          sVar85 = (short)local_3b8.v_oversample;
          sVar50 = (short)local_3b8.padding;
          local_348._0_8_ = (long)psVar100[1].userdata + 6;
          lVar58 = 0;
          iVar93 = 0;
          local_400 = uVar75;
          do {
            fVar110 = *(float *)(uVar75 + lVar58 * 0x28);
            auVar150 = ZEXT416((uint)fVar110);
            if (fVar110 <= 0.0) {
              auVar150._0_4_ = -fVar110;
              auVar150._4_4_ = 0x80000000;
              auVar150._8_4_ = 0x80000000;
              auVar150._12_4_ = 0x80000000;
              uVar56 = (uint)(ushort)(*(ushort *)(psVar100->data + (long)psVar100->head + 0x12) << 8
                                     | *(ushort *)(psVar100->data + (long)psVar100->head + 0x12) >>
                                       8);
            }
            else {
              puVar65 = psVar100->data;
              lVar77 = (long)psVar100->hhea;
              uVar56 = ((int)(short)((ushort)puVar65[lVar77 + 4] << 8) | (uint)puVar65[lVar77 + 5])
                       - ((int)(short)((ushort)puVar65[lVar77 + 6] << 8) | (uint)puVar65[lVar77 + 7]
                         );
            }
            auVar111._4_12_ = auVar150._4_12_;
            fVar110 = auVar150._0_4_ / (float)(int)uVar56;
            lVar77 = uVar75 + lVar58 * 0x28;
            *(char *)(lVar77 + 0x20) = (char)uVar147;
            *(char *)(lVar77 + 0x21) = (char)local_448;
            if (0 < *(int *)(lVar77 + 0x10)) {
              local_428._0_8_ = lVar58;
              local_468._0_4_ = fVar110 * local_3ec;
              auVar111._0_4_ = fVar110 * local_408._0_4_;
              psVar99 = (short *)((long)iVar93 * 0x10 + local_348._0_8_);
              lVar58 = 0;
              _local_458 = auVar111;
              do {
                iVar57 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar100->data,psVar100->index_map);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar100,iVar57,(float)local_468._0_4_,local_458._0_4_,auVar112._0_4_,
                           in_XMM3._0_4_,(int *)local_238,(int *)&local_3e8,(int *)&local_3f8,
                           (int *)&local_46c);
                psVar99[-1] = (((short)(stbtt_uint32)local_3f8 + (short)uVar147) -
                              (short)local_238._0_8_) + sVar50 + -1;
                *psVar99 = ~(ushort)local_3e8.data + (short)local_46c + sVar85 + sVar50;
                lVar58 = lVar58 + 1;
                psVar99 = psVar99 + 8;
              } while (lVar58 < *(int *)(lVar77 + 0x10));
              iVar93 = iVar93 + (int)lVar58;
              uVar75 = local_400;
              lVar58 = local_428._0_8_;
            }
            lVar58 = lVar58 + 1;
          } while (lVar58 != CONCAT44(iVar80,iVar76));
        }
        psVar59 = (stbrp_context *)local_3b8.pack_info;
        uVar75 = local_3d0;
        iVar76 = (int)local_3d0;
        if (iVar93 != iVar76) {
          __assert_fail("n == font_glyphs_count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                        ,0x6f7,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        stbrp_pack_rects((stbrp_context *)local_3b8.pack_info,(stbrp_rect *)psVar100[1].userdata,
                         iVar76);
        if (0 < iVar76) {
          pvVar63 = psVar100[1].userdata;
          lVar58 = 0;
          do {
            if (*(int *)((long)pvVar63 + lVar58 + 0xc) != 0) {
              iVar80 = (uint)*(ushort *)((long)pvVar63 + lVar58 + 6) +
                       (uint)*(ushort *)((long)pvVar63 + lVar58 + 10);
              if (iVar80 < atlas->TexHeight) {
                iVar80 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar80;
            }
            lVar58 = lVar58 + 0x10;
          } while ((uVar75 & 0xffffffff) << 4 != lVar58);
        }
        iVar76 = iVar76 + (uint)local_3d8;
        lVar58 = local_360 + 1;
      } while (lVar58 < (atlas->ConfigData).Size);
    }
    if (iVar76 != (int)local_430) {
      __assert_fail("buf_rects_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x6ff,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if (local_47c != (int)local_430) {
      __assert_fail("buf_packedchars_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x700,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if ((int)local_478 != (int)local_438) {
      __assert_fail("buf_ranges_n == total_ranges_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x701,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    uVar56 = atlas->TexHeight;
    if ((atlas->Flags & 1) == 0) {
      uVar56 = (int)(uVar56 - 1) >> 1 | uVar56 - 1;
      uVar56 = (int)uVar56 >> 2 | uVar56;
      uVar56 = (int)uVar56 >> 4 | uVar56;
      uVar56 = (int)uVar56 >> 8 | uVar56;
      uVar56 = (int)uVar56 >> 0x10 | uVar56;
    }
    iVar76 = uVar56 + 1;
    atlas->TexHeight = iVar76;
    auVar112._0_4_ = (float)atlas->TexWidth;
    auVar112._4_4_ = (float)iVar76;
    auVar112._8_8_ = 0;
    auVar112 = divps(_DAT_001a6ab0,auVar112);
    atlas->TexUvScale = auVar112._0_8_;
    puVar65 = (uchar *)ImGui::MemAlloc((long)(iVar76 * atlas->TexWidth));
    atlas->TexPixelsAlpha8 = puVar65;
    memset(puVar65,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
    local_3b8.pixels = atlas->TexPixelsAlpha8;
    local_3b8.height = atlas->TexHeight;
    if (0 < (atlas->ConfigData).Size) {
      lVar58 = 0;
      do {
        psVar60 = local_418;
        local_2f0 = (atlas->ConfigData).Data;
        local_2f8 = lVar58 * 0x80;
        local_410 = (stbtt_fontinfo *)(local_418 + lVar58 * 0xc);
        local_2e8 = lVar58;
        stbtt_PackSetOversampling
                  (&local_3b8,local_2f0[lVar58].OversampleH,local_2f0[lVar58].OversampleV);
        local_288._0_4_ = local_3b8.h_oversample;
        local_288._4_4_ = local_3b8.v_oversample;
        uStack_280 = 0;
        local_2d0 = (long)*(int *)&psVar60[lVar58 * 0xc + 0xb].next;
        if (0 < (long)*(int *)&psVar60[lVar58 * 0xc + 0xb].next) {
          psVar60 = local_418 + lVar58 * 0xc + 10;
          lVar77._0_2_ = psVar60->x;
          lVar77._2_2_ = psVar60->y;
          lVar77._4_4_ = *(undefined4 *)&psVar60->field_0x4;
          psVar60 = local_418 + lVar58 * 0xc + 0xb;
          lVar58._0_2_ = psVar60->x;
          lVar58._2_2_ = psVar60->y;
          lVar58._4_4_ = *(undefined4 *)&psVar60->field_0x4;
          lVar96 = 0;
          lVar78 = 0;
          local_320 = lVar77;
          local_2d8 = lVar58;
          do {
            uStack_2fc = 0x80000000;
            uStack_300 = 0x80000000;
            uStack_304 = 0x80000000;
            fVar110 = *(float *)(lVar58 + lVar96 * 0x28);
            if (fVar110 <= 0.0) {
              fVar110 = -fVar110;
              uVar56 = (uint)(ushort)(*(ushort *)(local_410->data + (long)local_410->head + 0x12) <<
                                      8 | *(ushort *)
                                           (local_410->data + (long)local_410->head + 0x12) >> 8);
            }
            else {
              puVar65 = local_410->data;
              lVar77 = (long)local_410->hhea;
              uVar56 = ((int)(short)((ushort)puVar65[lVar77 + 4] << 8) | (uint)puVar65[lVar77 + 5])
                       - ((int)(short)((ushort)puVar65[lVar77 + 6] << 8) | (uint)puVar65[lVar77 + 7]
                         );
              uStack_304 = 0;
              uStack_300 = 0;
              uStack_2fc = 0;
              lVar77 = local_320;
            }
            local_308 = fVar110 / (float)(int)uVar56;
            lVar101 = lVar58 + lVar96 * 0x28;
            uVar75 = *(ulong *)(lVar101 + 0x20);
            auVar38._8_6_ = 0;
            auVar38._0_8_ = uVar75;
            auVar38[0xe] = (char)(uVar75 >> 0x38);
            auVar41._8_4_ = 0;
            auVar41._0_8_ = uVar75;
            auVar41[0xc] = (char)(uVar75 >> 0x30);
            auVar41._13_2_ = auVar38._13_2_;
            auVar42._8_4_ = 0;
            auVar42._0_8_ = uVar75;
            auVar42._12_3_ = auVar41._12_3_;
            auVar43._8_2_ = 0;
            auVar43._0_8_ = uVar75;
            auVar43[10] = (char)(uVar75 >> 0x28);
            auVar43._11_4_ = auVar42._11_4_;
            auVar44._8_2_ = 0;
            auVar44._0_8_ = uVar75;
            auVar44._10_5_ = auVar43._10_5_;
            auVar45[8] = (char)(uVar75 >> 0x20);
            auVar45._0_8_ = uVar75;
            auVar45._9_6_ = auVar44._9_6_;
            cVar109 = (char)(uVar75 >> 0x18);
            Var29 = CONCAT91((unkuint9)auVar45._8_7_ << 8,cVar109);
            auVar35[10] = 0;
            auVar35._0_10_ = Var29;
            cVar108 = (char)(uVar75 >> 0x10);
            auVar28._1_11_ = auVar35 << 8;
            auVar28[0] = cVar108;
            auVar34[0xc] = 0;
            auVar34._0_12_ = auVar28;
            cVar107 = (char)(uVar75 >> 8);
            auVar27._1_13_ = auVar34 << 8;
            auVar27[0] = cVar107;
            bVar103 = (byte)uVar75;
            auVar106._0_2_ = CONCAT11(0,bVar103);
            auVar106._2_14_ = auVar27;
            uVar117 = (ushort)Var29;
            auVar39._10_2_ = 0;
            auVar39._0_10_ = auVar106._0_10_;
            auVar39._12_2_ = uVar117;
            uVar46 = CONCAT42(auVar39._10_4_,auVar28._0_2_);
            uVar48 = auVar27._0_2_;
            auVar30._2_10_ = (unkuint10)uVar46 << 0x10;
            auVar30._0_2_ = uVar48;
            auVar113._0_4_ = CONCAT22(0,auVar106._0_2_);
            auVar113._4_12_ = auVar30;
            local_3b8._32_8_ = auVar113._0_8_;
            iVar76 = *(int *)(lVar101 + 0x10);
            if (0 < iVar76) {
              local_2c8 = lVar96;
              auVar114._0_4_ = (float)auVar113._0_4_;
              auVar114._4_4_ = (float)auVar30._0_4_;
              auVar114._8_4_ = (float)(int)uVar46;
              auVar114._12_4_ = (float)uVar117;
              auVar124 = (undefined1  [16])0x0;
              local_258 = divps(_DAT_001a6ab0,auVar114);
              auVar126[0] = -(bVar103 == 0);
              auVar126[1] = -(bVar103 == 0);
              auVar126[2] = -(bVar103 == 0);
              auVar126[3] = -(bVar103 == 0);
              auVar126[4] = -(cVar107 == '\0');
              auVar126[5] = -(cVar107 == '\0');
              auVar126[6] = -(cVar107 == '\0');
              auVar126[7] = -(cVar107 == '\0');
              auVar126[8] = -(cVar108 == '\0');
              auVar126[9] = -(cVar108 == '\0');
              auVar126[10] = -(cVar108 == '\0');
              auVar126[0xb] = -(cVar108 == '\0');
              auVar126[0xc] = -(cVar109 == '\0');
              auVar126[0xd] = -(cVar109 == '\0');
              auVar126[0xe] = -(cVar109 == '\0');
              auVar126[0xf] = -(cVar109 == '\0');
              sVar85 = -auVar28._0_2_;
              sVar50 = -uVar117;
              Var33 = CONCAT64(CONCAT42(CONCAT22(sVar50,sVar50),sVar85),CONCAT22(sVar85,sVar50));
              auVar31._4_8_ = (long)((unkuint10)Var33 >> 0x10);
              auVar31._2_2_ = 1 - uVar48;
              auVar31._0_2_ = 1 - uVar48;
              auVar119._0_4_ = (float)(int)(short)(1 - auVar106._0_2_);
              auVar119._4_4_ = (float)(auVar31._0_4_ >> 0x10);
              auVar119._8_4_ = (float)((int)((unkuint10)Var33 >> 0x10) >> 0x10);
              auVar119._12_4_ = (float)(int)sVar50;
              auVar115._0_4_ = auVar114._0_4_ + auVar114._0_4_;
              auVar115._4_4_ = auVar114._4_4_ + auVar114._4_4_;
              auVar115._8_4_ = auVar114._8_4_ + auVar114._8_4_;
              auVar115._12_4_ = auVar114._12_4_ + auVar114._12_4_;
              auVar112 = divps(auVar119,auVar115);
              local_248 = ~auVar126 & auVar112;
              uVar97 = (ulong)auVar106._0_2_;
              lVar78 = (long)(int)lVar78;
              uVar75 = (ulong)uVar48;
              local_268._4_4_ = local_258._4_4_;
              local_268._0_4_ = local_268._4_4_;
              local_268._8_4_ = local_268._4_4_;
              local_268._12_4_ = local_268._4_4_;
              local_278._4_4_ = SUB164(~auVar126 & auVar112,4);
              local_278._0_4_ = local_278._4_4_;
              local_278._8_4_ = local_278._4_4_;
              local_278._12_4_ = local_278._4_4_;
              lVar92 = 0;
              local_370 = lVar101;
              do {
                psVar100 = local_410;
                if (*(int *)(lVar77 + 0xc + lVar78 * 0x10) != 0) {
                  lVar77 = lVar78 * 0x10 + lVar77;
                  local_2a0 = (short *)(lVar92 * 0x1c + *(long *)(lVar101 + 0x18));
                  local_368 = lVar92;
                  local_298 = lVar78;
                  iVar80 = stbtt_FindGlyphIndex
                                     ((stbtt_fontinfo *)local_410->data,local_410->index_map);
                  uVar147 = *(undefined8 *)(lVar77 + 4);
                  auVar112 = pshuflw(ZEXT416((uint)local_3b8.padding),
                                     ZEXT416((uint)local_3b8.padding),0);
                  *(ulong *)(lVar77 + 4) =
                       CONCAT44(CONCAT22((short)((ulong)uVar147 >> 0x30) + auVar112._6_2_,
                                         (short)((ulong)uVar147 >> 0x20) + auVar112._4_2_),
                                CONCAT22((short)((ulong)uVar147 >> 0x10) - auVar112._2_2_,
                                         (short)uVar147 - auVar112._0_2_));
                  puVar65 = psVar100->data;
                  uVar48 = *(ushort *)(puVar65 + (long)psVar100->hhea + 0x22) << 8 |
                           *(ushort *)(puVar65 + (long)psVar100->hhea + 0x22) >> 8;
                  iVar76 = psVar100->hmtx;
                  lVar58 = (ulong)uVar48 * 4 + (long)iVar76 + -4;
                  lVar78 = (ulong)uVar48 * 4 + (long)iVar76 + -3;
                  if (iVar80 < (int)(uint)uVar48) {
                    lVar58 = (long)(iVar80 * 4) + (long)iVar76;
                    lVar78 = (long)(iVar80 * 4) + 1 + (long)iVar76;
                  }
                  local_354 = (uint)puVar65[lVar78];
                  local_350 = (uint)puVar65[lVar58];
                  _local_458 = ZEXT416((uint)((float)uVar97 * local_308));
                  local_468 = ZEXT416((uint)((float)uVar75 * local_308));
                  fVar110 = local_308;
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar100,iVar80,(float)uVar97 * local_308,(float)uVar75 * local_308,
                             local_308,auVar124._0_4_,(int *)&local_440,&local_34c,&local_28c,
                             &local_290);
                  local_310 = local_3b8.pixels + *(ushort *)(lVar77 + 8);
                  uVar48 = *(ushort *)(lVar77 + 10);
                  local_318 = (long)local_3b8.stride_in_bytes;
                  uVar81 = (uint)*(ushort *)(lVar77 + 4) - (int)uVar97;
                  uVar97 = (ulong)uVar81;
                  uVar117 = *(ushort *)(lVar77 + 6);
                  local_438 = lVar77;
                  uVar56 = stbtt_GetGlyphShape(psVar100,iVar80,(stbtt_vertex **)&local_3f8);
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar100,iVar80,(float)local_458._0_4_,(float)local_468._0_4_,fVar110,
                             auVar124._0_4_,(int *)&local_46c,(int *)&local_43c,(int *)0x0,
                             (int *)0x0);
                  iVar76 = uVar81 + 1;
                  local_400 = CONCAT44(local_400._4_4_,iVar76);
                  local_3d8 = uVar97;
                  if (iVar76 != 0) {
                    uVar81 = (uint)uVar117 - (int)uVar75;
                    if (uVar81 + 1 != 0) {
                      local_428._0_4_ = uVar81 + 1;
                      local_3c4 = uVar81;
                      if (0 < (int)uVar56) {
                        local_310 = local_310 + (ulong)uVar48 * local_318;
                        lVar58 = CONCAT44(local_3f8._4_4_,(stbtt_uint32)local_3f8);
                        local_3f0 = local_43c;
                        fVar110 = (float)local_468._0_4_;
                        if ((float)local_458._0_4_ <= (float)local_468._0_4_) {
                          fVar110 = (float)local_458._0_4_;
                        }
                        fVar110 = (0.35 / fVar110) * (0.35 / fVar110);
                        lVar77 = 0;
                        uVar81 = 0;
                        do {
                          uVar81 = uVar81 + (*(char *)(lVar58 + 0xc + lVar77) == '\x01');
                          lVar77 = lVar77 + 0xe;
                        } while ((ulong)uVar56 * 0xe != lVar77);
                        if (uVar81 != 0) {
                          uVar75 = (ulong)uVar81;
                          sVar55 = local_46c;
                          ptr = (stbtt__point *)ImGui::MemAlloc(uVar75 * 4);
                          if (ptr != (stbtt__point *)0x0) {
                            bVar73 = false;
                            fVar133 = 0.0;
                            points = (stbtt__point *)0x0;
                            fVar128 = 0.0;
                            bVar47 = true;
                            do {
                              bVar83 = bVar47;
                              if ((bVar73) &&
                                 (points = (stbtt__point *)ImGui::MemAlloc((long)(int)fVar128 << 3),
                                 points == (stbtt__point *)0x0)) {
                                ImGui::MemFree((void *)0x0);
                                goto LAB_00183db6;
                              }
                              local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                              fVar128 = 0.0;
                              fVar104 = 0.0;
                              uVar97 = 0xffffffff;
                              lVar77 = 0;
                              local_408 = points;
                              do {
                                uVar145 = local_238._0_4_;
                                switch(*(undefined1 *)(lVar58 + 0xc + lVar77)) {
                                case 1:
                                  if (-1 < (int)uVar97) {
                                    (&ptr->x)[uVar97] = (float)(local_238._0_4_ - (int)fVar133);
                                  }
                                  uVar97 = (ulong)((int)uVar97 + 1);
                                  auVar112 = pshuflw(ZEXT416(*(uint *)(lVar58 + lVar77)),
                                                     ZEXT416(*(uint *)(lVar58 + lVar77)),0x60);
                                  fVar128 = (float)(auVar112._0_4_ >> 0x10);
                                  fVar104 = (float)(auVar112._4_4_ >> 0x10);
                                  local_238._0_4_ = local_238._0_4_ + 1;
                                  fVar133 = (float)uVar145;
                                  if (points != (stbtt__point *)0x0) {
                                    points[(int)uVar145].x = fVar128;
                                    points[(int)uVar145].y = fVar104;
                                  }
                                  break;
                                case 2:
                                  lVar78 = (long)(int)local_238._0_4_;
                                  auVar112 = pshuflw(ZEXT416(*(uint *)(lVar58 + lVar77)),
                                                     ZEXT416(*(uint *)(lVar58 + lVar77)),0x60);
                                  fVar128 = (float)(auVar112._0_4_ >> 0x10);
                                  fVar104 = (float)(auVar112._4_4_ >> 0x10);
                                  local_238._0_4_ = local_238._0_4_ + 1;
                                  if (points != (stbtt__point *)0x0) {
                                    points[lVar78].x = fVar128;
                                    points[lVar78].y = fVar104;
                                  }
                                  break;
                                case 3:
                                  fVar118 = (float)(int)*(short *)(lVar58 + 6 + lVar77);
                                  auVar124 = ZEXT416((uint)fVar118);
                                  stbtt__tesselate_curve
                                            (points,(int *)local_238,fVar128,fVar104,
                                             (float)(int)*(short *)(lVar58 + 4 + lVar77),fVar118,
                                             (float)(int)*(short *)(lVar58 + lVar77),
                                             (float)(int)*(short *)(lVar58 + 2 + lVar77),fVar110,0);
                                  goto LAB_0018318e;
                                case 4:
                                  fVar118 = (float)(int)*(short *)(lVar58 + 6 + lVar77);
                                  auVar124 = ZEXT416((uint)fVar118);
                                  stbtt__tesselate_cubic
                                            (points,(int *)local_238,fVar128,fVar104,
                                             (float)(int)*(short *)(lVar58 + 4 + lVar77),fVar118,
                                             (float)(int)*(short *)(lVar58 + 8 + lVar77),
                                             (float)(int)*(short *)(lVar58 + 10 + lVar77),
                                             (float)(int)*(short *)(lVar58 + lVar77),
                                             (float)(int)*(short *)(lVar58 + 2 + lVar77),fVar110,0);
LAB_0018318e:
                                  auVar112 = pshuflw(ZEXT416(*(uint *)(lVar58 + lVar77)),
                                                     ZEXT416(*(uint *)(lVar58 + lVar77)),0x60);
                                  fVar128 = (float)(auVar112._0_4_ >> 0x10);
                                  fVar104 = (float)(auVar112._4_4_ >> 0x10);
                                  points = local_408;
                                }
                                lVar77 = lVar77 + 0xe;
                              } while ((ulong)uVar56 * 0xe != lVar77);
                              (&ptr->x)[(int)uVar97] = (float)(local_238._0_4_ - (int)fVar133);
                              bVar73 = true;
                              fVar128 = (float)local_238._0_4_;
                              bVar47 = false;
                            } while (bVar83);
                            if (points != (stbtt__point *)0x0) {
                              uVar97 = 0;
                              lVar58 = 0;
                              do {
                                lVar58 = (long)(int)lVar58 + (long)(int)(&ptr->x)[uVar97];
                                uVar97 = uVar97 + 1;
                              } while (uVar75 != uVar97);
                              psVar66 = (stbtt__edge *)ImGui::MemAlloc(lVar58 * 0x14 + 0x14);
                              if (psVar66 != (stbtt__edge *)0x0) {
                                auVar124._0_8_ =
                                     CONCAT44(local_468._0_4_,local_458._0_4_) ^ 0x8000000000000000;
                                auVar124._8_8_ = auVar124._0_8_;
                                uVar97 = 0;
                                uVar56 = 0;
                                iVar76 = 0;
                                do {
                                  fVar110 = (&ptr->x)[uVar97];
                                  if (0 < (int)fVar110) {
                                    uVar87 = (ulong)((int)fVar110 - 1);
                                    uVar95 = 0;
                                    fVar128 = fVar110;
                                    do {
                                      iVar80 = (int)uVar87;
                                      fVar133 = local_408[(long)iVar76 + (long)iVar80].y;
                                      fVar104 = local_408[(long)iVar76 + uVar95].y;
                                      if ((fVar133 != fVar104) || (NAN(fVar133) || NAN(fVar104))) {
                                        iVar93 = (int)uVar95;
                                        if (fVar133 <= fVar104) {
                                          iVar93 = iVar80;
                                          iVar80 = (int)uVar95;
                                        }
                                        psVar66[(int)uVar56].invert = (uint)(fVar104 < fVar133);
                                        sVar2 = local_408[(long)iVar76 + (long)iVar80];
                                        sVar3 = local_408[(long)iVar76 + (long)iVar93];
                                        psVar86 = psVar66 + (int)uVar56;
                                        psVar86->x0 = sVar2.x * (float)local_458._0_4_ + 0.0;
                                        psVar86->y0 = sVar2.y * -(float)local_468._0_4_ + 0.0;
                                        psVar86->x1 = sVar3.x * (float)local_458._0_4_ + 0.0;
                                        psVar86->y1 = sVar3.y * -(float)local_468._0_4_ + 0.0;
                                        uVar56 = uVar56 + 1;
                                        fVar128 = (&ptr->x)[uVar97];
                                      }
                                      uVar87 = uVar95 & 0xffffffff;
                                      uVar95 = uVar95 + 1;
                                    } while ((long)uVar95 < (long)(int)fVar128);
                                  }
                                  iVar76 = iVar76 + (int)fVar110;
                                  uVar97 = uVar97 + 1;
                                } while (uVar97 != uVar75);
                                stbtt__sort_edges_quicksort(psVar66,uVar56);
                                if (1 < (int)uVar56) {
                                  uVar75 = 1;
                                  lVar58 = 2;
                                  psVar86 = psVar66;
                                  do {
                                    uVar1 = psVar66[uVar75].x0;
                                    uVar4 = psVar66[uVar75].y0;
                                    iVar76 = psVar66[uVar75].invert;
                                    stack0xfffffffffffffdd0 =
                                         (stbrp_node *)CONCAT44(iStack_22c,iVar76);
                                    local_238._0_8_ = *(undefined8 *)&psVar66[uVar75].x1;
                                    lVar77 = lVar58;
                                    psVar91 = psVar86;
                                    do {
                                      if (psVar91->y0 <= (float)uVar4) {
                                        uVar81 = (int)lVar77 - 1;
                                        goto LAB_001833ac;
                                      }
                                      psVar91[1].invert = psVar91->invert;
                                      fVar110 = psVar91->y0;
                                      fVar128 = psVar91->x1;
                                      fVar133 = psVar91->y1;
                                      psVar91[1].x0 = psVar91->x0;
                                      psVar91[1].y0 = fVar110;
                                      psVar91[1].x1 = fVar128;
                                      psVar91[1].y1 = fVar133;
                                      lVar77 = lVar77 + -1;
                                      psVar91 = psVar91 + -1;
                                    } while (1 < lVar77);
                                    uVar81 = 0;
LAB_001833ac:
                                    if (uVar75 != uVar81) {
                                      psVar66[(int)uVar81].x0 = (float)uVar1;
                                      psVar66[(int)uVar81].y0 = (float)uVar4;
                                      *(undefined8 *)&psVar66[(int)uVar81].x1 = local_238._0_8_;
                                      psVar66[(int)uVar81].invert = iVar76;
                                    }
                                    uVar75 = uVar75 + 1;
                                    lVar58 = lVar58 + 1;
                                    psVar86 = psVar86 + 1;
                                  } while (uVar75 != uVar56);
                                }
                                auVar32._8_8_ = 0;
                                auVar32._0_4_ = local_3e8.cursor;
                                auVar32._4_4_ = local_3e8.size;
                                local_3e8 = (stbtt__buf)(auVar32 << 0x40);
                                pfVar67 = (float *)local_238;
                                if (0x40 < (int)local_400) {
                                  pfVar67 = (float *)ImGui::MemAlloc((local_400 & 0xffffffff) * 8 +
                                                                     4);
                                }
                                psVar66[(int)uVar56].y0 =
                                     (float)(int)(local_428._0_4_ + local_3f0) + 1.0;
                                if (local_3c4 < 0x7fffffff) {
                                  local_2c0 = (long)(int)local_400;
                                  local_360 = CONCAT44(local_360._4_4_,(float)(int)sVar55);
                                  local_430 = pfVar67 + local_2c0;
                                  local_328 = local_430 + 1;
                                  local_2b0 = local_2c0 * 4;
                                  local_3d0 = CONCAT44(local_3d0._4_4_,(float)(int)local_400);
                                  local_2b8 = (long)((int)local_3d8 + 2) << 2;
                                  local_378 = 0;
                                  uVar75 = 0;
                                  local_3c0 = (undefined8 *)0x0;
                                  local_47c = 0;
                                  psVar102 = (stbtt__buf *)0x0;
                                  psVar71 = (stbtt__buf *)0x0;
                                  psVar86 = psVar66;
                                  sVar55 = local_3f0;
                                  local_2e0 = psVar66;
                                  do {
                                    local_448 = CONCAT44(local_448._4_4_,(float)(int)sVar55);
                                    fVar110 = (float)(int)sVar55 + 1.0;
                                    local_3f0 = sVar55;
                                    local_2a8 = uVar75;
                                    memset(pfVar67,0,local_2b0);
                                    memset(local_430,0,local_2b8);
                                    puVar79 = local_3c0;
                                    if (psVar71 != (stbtt__buf *)0x0) {
                                      psVar68 = &local_3e8;
                                      do {
                                        psVar69 = psVar71;
                                        if ((float)psVar71[1].size <= (float)local_448) {
                                          psVar68->data = psVar71->data;
                                          fVar128 = *(float *)((long)&psVar71[1].data + 4);
                                          if ((fVar128 == 0.0) && (!NAN(fVar128))) {
                                            __assert_fail("z->direction",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                                  ,0xc4f,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                          }
                                          puVar65 = (uchar *)((long)&psVar71[1].data + 4);
                                          puVar65[0] = '\0';
                                          puVar65[1] = '\0';
                                          puVar65[2] = '\0';
                                          puVar65[3] = '\0';
                                          psVar71->data = (uchar *)psVar102;
                                          psVar69 = psVar68;
                                          psVar102 = psVar71;
                                        }
                                        psVar71 = (stbtt__buf *)psVar69->data;
                                        psVar68 = psVar69;
                                      } while (psVar71 != (stbtt__buf *)0x0);
                                    }
                                    fVar128 = psVar86->y0;
                                    fVar133 = (float)local_448;
                                    while (fVar128 <= fVar110) {
                                      fVar104 = psVar86->y1;
                                      puVar70 = puVar79;
                                      if ((fVar128 != fVar104) ||
                                         (psVar71 = psVar102, NAN(fVar128) || NAN(fVar104))) {
                                        if (psVar102 == (stbtt__buf *)0x0) {
                                          if (local_47c == 0) {
                                            puVar70 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                            if (puVar70 == (undefined8 *)0x0) {
                                              __assert_fail("z != __null",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                                  ,0xabf,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                            }
                                            *puVar70 = puVar79;
                                            fVar128 = psVar86->y0;
                                            fVar104 = psVar86->y1;
                                            local_47c = 799;
                                            fVar133 = (float)local_448;
                                          }
                                          else {
                                            local_47c = local_47c + -1;
                                          }
                                          psVar102 = (stbtt__buf *)
                                                     (puVar70 + (long)local_47c * 4 + 1);
                                          psVar71 = (stbtt__buf *)0x0;
                                        }
                                        else {
                                          psVar71 = (stbtt__buf *)psVar102->data;
                                        }
                                        fVar118 = psVar86->x0;
                                        fVar123 = (psVar86->x1 - fVar118) / (fVar104 - fVar128);
                                        psVar102->size = (int)fVar123;
                                        *(uint *)&psVar102[1].data =
                                             -(uint)(fVar123 != 0.0) & (uint)(1.0 / fVar123);
                                        psVar102->cursor =
                                             (int)(((fVar133 - fVar128) * fVar123 + fVar118) -
                                                  (float)local_360);
                                        *(undefined4 *)((long)&psVar102[1].data + 4) =
                                             *(undefined4 *)
                                              (&DAT_001b24a0 + (ulong)(psVar86->invert == 0) * 4);
                                        psVar102[1].cursor = (int)fVar128;
                                        psVar102[1].size = (int)fVar104;
                                        psVar102->data = (uchar *)0x0;
                                        if (fVar104 < fVar133) {
                                          __assert_fail("z->ey >= scan_y_top",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                                  ,0xc5c,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                        }
                                        psVar102->data = local_3e8.data;
                                        local_3e8.data = (uchar *)psVar102;
                                      }
                                      psVar66 = psVar86 + 1;
                                      psVar86 = psVar86 + 1;
                                      puVar79 = puVar70;
                                      psVar102 = psVar71;
                                      fVar128 = psVar66->y0;
                                    }
                                    local_3c0 = puVar79;
                                    for (e = (stbtt__active_edge *)local_3e8.data;
                                        psVar66 = local_2e0, e != (stbtt__active_edge *)0x0;
                                        e = e->next) {
                                      fVar128 = e->ey;
                                      if (fVar128 < fVar133) {
                                        __assert_fail("e->ey >= y_top",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                                  ,0xb93,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      fVar104 = e->fx;
                                      auVar137._0_8_ = CONCAT44(0,fVar104);
                                      auVar137._8_8_ = 0;
                                      fVar118 = e->fdx;
                                      if ((fVar118 != 0.0) || (NAN(fVar118))) {
                                        fVar123 = e->sy;
                                        if (fVar110 < fVar123) {
                                          __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                                  ,0xba6,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        fVar159 = fVar118 + fVar104;
                                        fVar135 = (float)(~-(uint)(fVar133 < fVar123) &
                                                          (uint)fVar104 |
                                                         (uint)((fVar123 - fVar133) * fVar118 +
                                                               fVar104) & -(uint)(fVar133 < fVar123)
                                                         );
                                        if ((((fVar135 < 0.0) ||
                                             (fVar143 = (float)(~-(uint)(fVar128 < fVar110) &
                                                                (uint)fVar159 |
                                                               (uint)((fVar128 - fVar133) * fVar118
                                                                     + fVar104) &
                                                               -(uint)(fVar128 < fVar110)),
                                             fVar143 < 0.0)) || ((float)local_3d0 <= fVar135)) ||
                                           ((float)local_3d0 <= fVar143)) {
                                          if ((uint)local_3d8 < 0x7fffffff) {
                                            local_428 = ZEXT416((uint)fVar159);
                                            local_3ec = fVar118;
                                            local_348 = auVar137;
                                            iVar76 = 0;
                                            do {
                                              fVar128 = (float)iVar76;
                                              iVar80 = iVar76 + 1;
                                              fVar104 = (float)iVar80;
                                              fVar118 = local_348._0_4_;
                                              fVar123 = (fVar128 - fVar118) / local_3ec + fVar133;
                                              fVar135 = (fVar104 - fVar118) / local_3ec + fVar133;
                                              local_458._0_4_ = fVar128;
                                              fVar159 = local_428._0_4_;
                                              if ((fVar128 <= fVar118) || (fVar159 <= fVar104)) {
                                                if ((fVar128 <= fVar159) || (fVar118 <= fVar104)) {
                                                  if (((fVar128 <= fVar118) || (fVar159 <= fVar128))
                                                     && ((fVar128 <= fVar159 || (fVar118 <= fVar128)
                                                         ))) {
                                                    if (((fVar118 < fVar104) && (fVar104 < fVar159))
                                                       || ((fVar123 = fVar133, fVar159 < fVar104 &&
                                                           (fVar104 < fVar118)))) {
                                                      local_468._0_4_ = fVar104;
                                                      goto LAB_0018395a;
                                                    }
                                                    goto LAB_00183a09;
                                                  }
                                                }
                                                else {
                                                  local_468._0_4_ = fVar104;
                                                  stbtt__handle_clipped_edge
                                                            (pfVar67,iVar76,e,fVar118,fVar133,
                                                             fVar104,fVar135);
                                                  fVar118 = (float)local_468._0_4_;
                                                  fVar128 = (float)local_458._0_4_;
                                                  fVar133 = fVar135;
                                                }
                                                stbtt__handle_clipped_edge
                                                          (pfVar67,iVar76,e,fVar118,fVar133,fVar128,
                                                           fVar123);
                                                fVar118 = (float)local_458._0_4_;
                                              }
                                              else {
                                                local_468._0_4_ = fVar104;
                                                stbtt__handle_clipped_edge
                                                          (pfVar67,iVar76,e,fVar118,fVar133,fVar128,
                                                           fVar123);
                                                fVar118 = (float)local_458._0_4_;
                                                fVar104 = (float)local_468._0_4_;
                                                fVar133 = fVar123;
LAB_0018395a:
                                                stbtt__handle_clipped_edge
                                                          (pfVar67,iVar76,e,fVar118,fVar133,fVar104,
                                                           fVar135);
                                                fVar118 = (float)local_468._0_4_;
                                                fVar123 = fVar135;
                                              }
LAB_00183a09:
                                              stbtt__handle_clipped_edge
                                                        (pfVar67,iVar76,e,fVar118,fVar123,
                                                         local_428._0_4_,fVar110);
                                              iVar76 = iVar80;
                                              fVar133 = (float)local_448;
                                            } while ((int)local_400 != iVar80);
                                          }
                                        }
                                        else {
                                          if (fVar123 <= fVar133) {
                                            fVar123 = fVar133;
                                          }
                                          uVar56 = (uint)fVar135;
                                          if (fVar110 <= fVar128) {
                                            fVar128 = fVar110;
                                          }
                                          uVar81 = (uint)fVar143;
                                          if (uVar56 == uVar81) {
                                            if (((int)uVar56 < 0) || ((int)local_400 <= (int)uVar56)
                                               ) {
                                              __assert_fail("x >= 0 && x < len",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                                  ,0xbc2,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                            }
                                            uVar75 = (ulong)uVar56;
                                            pfVar67[uVar75] =
                                                 (((fVar143 - (float)(int)uVar56) +
                                                  (fVar135 - (float)(int)uVar56)) * -0.5 + 1.0) *
                                                 e->direction * (fVar128 - fVar123) +
                                                 pfVar67[uVar75];
                                            fVar104 = (fVar128 - fVar123) * e->direction;
                                          }
                                          else {
                                            fVar118 = e->fdy;
                                            uVar134 = uVar56;
                                            fVar144 = fVar135;
                                            if (fVar143 < fVar135) {
                                              fVar104 = fVar133 - fVar123;
                                              fVar123 = (fVar133 - fVar128) + fVar110;
                                              fVar118 = -fVar118;
                                              uVar134 = uVar81;
                                              uVar81 = uVar56;
                                              fVar128 = fVar104 + fVar110;
                                              fVar144 = fVar143;
                                              fVar143 = fVar135;
                                              fVar104 = fVar159;
                                            }
                                            iVar76 = uVar134 + 1;
                                            fVar159 = ((float)iVar76 - fVar104) * fVar118 + fVar133;
                                            fVar104 = e->direction;
                                            fVar135 = (fVar159 - fVar123) * fVar104;
                                            lVar58 = (long)(int)uVar134;
                                            pfVar67[lVar58] =
                                                 (((fVar144 - (float)(int)uVar134) + 1.0) * -0.5 +
                                                 1.0) * fVar135 + pfVar67[lVar58];
                                            if (uVar81 - iVar76 != 0 && iVar76 <= (int)uVar81) {
                                              do {
                                                pfVar67[lVar58 + 1] =
                                                     fVar118 * fVar104 * 0.5 + fVar135 +
                                                     pfVar67[lVar58 + 1];
                                                fVar135 = fVar135 + fVar118 * fVar104;
                                                lVar58 = lVar58 + 1;
                                              } while (uVar81 - 1 != (int)lVar58);
                                            }
                                            if (1.01 < ABS(fVar135)) {
                                              __assert_fail("fabs(area) <= 1.01f",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                                  ,0xbe7,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                            }
                                            uVar75 = (ulong)(int)uVar81;
                                            pfVar67[uVar75] =
                                                 (fVar128 -
                                                 (fVar118 * (float)(int)(uVar81 - iVar76) + fVar159)
                                                 ) * (((fVar143 - (float)(int)uVar81) + 0.0) * -0.5
                                                     + 1.0) * fVar104 + fVar135 + pfVar67[uVar75];
                                            fVar104 = (fVar128 - fVar123) * fVar104;
                                          }
                                          local_328[uVar75] = fVar104 + local_328[uVar75];
                                        }
                                      }
                                      else if (fVar104 < (float)local_3d0) {
                                        if (0.0 <= fVar104) {
                                          local_348 = auVar137;
                                          stbtt__handle_clipped_edge
                                                    (pfVar67,(int)fVar104,e,fVar104,fVar133,fVar104,
                                                     fVar110);
                                          iVar76 = (int)fVar104 + 1;
                                          auVar120 = local_348;
                                          fVar133 = (float)local_448;
                                        }
                                        else {
                                          iVar76 = 0;
                                          auVar120._8_8_ = 0;
                                          auVar120._0_8_ = auVar137._0_8_;
                                        }
                                        stbtt__handle_clipped_edge
                                                  (local_430,iVar76,e,auVar120._0_4_,fVar133,
                                                   auVar120._0_4_,fVar110);
                                        fVar133 = (float)local_448;
                                      }
                                    }
                                    auVar124._0_12_ = ZEXT812(0x3f000000);
                                    auVar124._12_4_ = 0;
                                    if ((uint)local_3d8 < 0x7fffffff) {
                                      fVar110 = 0.0;
                                      pfVar72 = pfVar67;
                                      uVar75 = local_378;
                                      lVar58 = local_2c0;
                                      do {
                                        fVar110 = fVar110 + pfVar72[local_2c0];
                                        iVar76 = (int)(ABS(*pfVar72 + fVar110) * 255.0 + 0.5);
                                        uVar84 = (uchar)iVar76;
                                        if (0xfe < iVar76) {
                                          uVar84 = 0xff;
                                        }
                                        local_310[(int)uVar75] = uVar84;
                                        uVar75 = (ulong)((int)uVar75 + 1);
                                        pfVar72 = pfVar72 + 1;
                                        lVar58 = lVar58 + -1;
                                      } while (lVar58 != 0);
                                    }
                                    for (psVar71 = (stbtt__buf *)local_3e8.data;
                                        psVar71 != (stbtt__buf *)0x0;
                                        psVar71 = (stbtt__buf *)psVar71->data) {
                                      psVar71->cursor =
                                           (int)((float)psVar71->size + (float)psVar71->cursor);
                                    }
                                    sVar55 = local_3f0 + 1;
                                    uVar75 = (ulong)((uint)local_2a8 + 1);
                                    local_378 = (ulong)(uint)((int)local_378 + (int)local_318);
                                    psVar71 = (stbtt__buf *)local_3e8.data;
                                    puVar79 = local_3c0;
                                  } while ((uint)local_2a8 != local_3c4);
                                  while (puVar79 != (undefined8 *)0x0) {
                                    puVar70 = (undefined8 *)*puVar79;
                                    ImGui::MemFree(puVar79);
                                    puVar79 = puVar70;
                                  }
                                }
                                if (pfVar67 != (float *)local_238) {
                                  ImGui::MemFree(pfVar67);
                                }
                                ImGui::MemFree(psVar66);
                              }
                              ImGui::MemFree(ptr);
                              ptr = local_408;
LAB_00183db6:
                              ImGui::MemFree(ptr);
                            }
                          }
                        }
                      }
                    }
                  }
                  ImGui::MemFree((void *)CONCAT44(local_3f8._4_4_,(stbtt_uint32)local_3f8));
                  auVar112 = _local_458;
                  uVar56 = local_3b8.h_oversample;
                  uVar97 = local_3b8._32_8_ & 0xffffffff;
                  uVar95 = (ulong)*(ushort *)(local_438 + 8);
                  uVar48 = *(ushort *)(local_438 + 10);
                  uVar117 = *(ushort *)(local_438 + 4);
                  uVar81 = (uint)uVar117;
                  uVar49 = *(ushort *)(local_438 + 6);
                  if (1 < uVar97) {
                    lVar58 = (long)local_3b8.stride_in_bytes;
                    local_238._0_8_ = (uchar *)0x0;
                    iVar76 = 0;
                    if (uVar49 == 0) {
                      uVar49 = 0;
                    }
                    else {
                      local_458._2_2_ = 0;
                      local_458._0_2_ = uVar49;
                      stack0xfffffffffffffbac = auVar112._4_12_;
                      puVar65 = local_3b8.pixels +
                                (ulong)uVar48 * lVar58 + (ulong)*(ushort *)(local_438 + 8);
                      iVar80 = uVar117 - local_3b8.h_oversample;
                      uVar81 = iVar80 + 1;
                      uVar75 = (ulong)uVar81;
                      do {
                        memset(local_238,0,uVar97);
                        uVar134 = uVar81;
                        switch(uVar56) {
                        case 2:
                          if (iVar80 < 0) {
LAB_00183fea:
                            uVar74 = 0;
                            uVar134 = 0;
                          }
                          else {
                            uVar95 = 0;
                            uVar74 = 0;
                            do {
                              bVar103 = puVar65[uVar95];
                              bVar6 = local_238[(uint)uVar95 & 7];
                              local_238[(uint)uVar95 + 2 & 7] = bVar103;
                              uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                              puVar65[uVar95] = (uchar)(uVar74 >> 1);
                              uVar95 = uVar95 + 1;
                            } while (uVar75 != uVar95);
                          }
                          break;
                        case 3:
                          if (iVar80 < 0) goto LAB_00183fea;
                          uVar95 = 0;
                          uVar74 = 0;
                          do {
                            bVar103 = puVar65[uVar95];
                            bVar6 = local_238[(uint)uVar95 & 7];
                            local_238[(uint)uVar95 + 3 & 7] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                            puVar65[uVar95] = (uchar)(uVar74 / 3);
                            uVar95 = uVar95 + 1;
                          } while (uVar75 != uVar95);
                          break;
                        case 4:
                          if (iVar80 < 0) goto LAB_00183fea;
                          uVar95 = 0;
                          uVar74 = 0;
                          do {
                            bVar103 = puVar65[uVar95];
                            uVar87 = (ulong)((uint)uVar95 & 7);
                            local_238[uVar87 ^ 4] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)(byte)local_238[uVar87]);
                            puVar65[uVar95] = (uchar)(uVar74 >> 2);
                            uVar95 = uVar95 + 1;
                          } while (uVar75 != uVar95);
                          break;
                        case 5:
                          if (iVar80 < 0) goto LAB_00183fea;
                          uVar95 = 0;
                          uVar74 = 0;
                          do {
                            bVar103 = puVar65[uVar95];
                            bVar6 = local_238[(uint)uVar95 & 7];
                            local_238[(uint)uVar95 + 5 & 7] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                            puVar65[uVar95] = (uchar)(uVar74 / 5);
                            uVar95 = uVar95 + 1;
                          } while (uVar75 != uVar95);
                          break;
                        default:
                          if (iVar80 < 0) goto LAB_00183fea;
                          uVar95 = 0;
                          uVar74 = 0;
                          do {
                            bVar103 = puVar65[uVar95];
                            bVar6 = local_238[(uint)uVar95 & 7];
                            local_238[uVar56 + (uint)uVar95 & 7] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                            puVar65[uVar95] = (uchar)(uVar74 / uVar56);
                            uVar95 = uVar95 + 1;
                          } while (uVar75 != uVar95);
                        }
                        if ((int)uVar134 < (int)(uint)uVar117) {
                          uVar95 = (ulong)uVar134;
                          do {
                            if (puVar65[uVar95] != '\0') {
                              __assert_fail("pixels[i] == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                            ,0xf21,
                                            "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar74 = uVar74 - (byte)local_238[(uint)uVar95 & 7];
                            puVar65[uVar95] = (uchar)(uVar74 / uVar56);
                            uVar95 = uVar95 + 1;
                          } while ((int)uVar95 < (int)(uint)uVar117);
                        }
                        puVar65 = puVar65 + lVar58;
                        iVar76 = iVar76 + 1;
                      } while (iVar76 != local_458._0_4_);
                      uVar95 = (ulong)*(ushort *)(local_438 + 8);
                      uVar48 = *(ushort *)(local_438 + 10);
                      uVar81 = (uint)*(ushort *)(local_438 + 4);
                      uVar49 = *(ushort *)(local_438 + 6);
                    }
                  }
                  sVar85 = (short)uVar95;
                  uVar56 = local_3b8.v_oversample;
                  uVar75 = (ulong)local_3b8.v_oversample;
                  if (1 < uVar75) {
                    lVar58 = (long)local_3b8.stride_in_bytes;
                    local_238._0_8_ = (uchar *)0x0;
                    iVar76 = 0;
                    if ((short)uVar81 == 0) {
                      uVar81 = 0;
                    }
                    else {
                      local_468._0_4_ = uVar81;
                      pbVar98 = local_3b8.pixels + (ulong)uVar48 * lVar58 + uVar95;
                      local_458._0_4_ = CONCAT22(0,uVar49);
                      iVar80 = CONCAT22(0,uVar49) - local_3b8.v_oversample;
                      uVar81 = iVar80 + 1;
                      uVar95 = (ulong)uVar81;
                      do {
                        memset(local_238,0,uVar75);
                        uVar134 = uVar81;
                        switch(uVar56) {
                        case 2:
                          if (iVar80 < 0) {
LAB_00184287:
                            uVar74 = 0;
                            uVar134 = 0;
                          }
                          else {
                            uVar87 = 0;
                            uVar74 = 0;
                            pbVar90 = pbVar98;
                            do {
                              bVar103 = *pbVar90;
                              bVar6 = local_238[(uint)uVar87 & 7];
                              local_238[(uint)uVar87 + 2 & 7] = bVar103;
                              uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                              *pbVar90 = (byte)(uVar74 >> 1);
                              uVar87 = uVar87 + 1;
                              pbVar90 = pbVar90 + lVar58;
                            } while (uVar95 != uVar87);
                          }
                          break;
                        case 3:
                          if (iVar80 < 0) goto LAB_00184287;
                          uVar87 = 0;
                          uVar74 = 0;
                          pbVar90 = pbVar98;
                          do {
                            bVar103 = *pbVar90;
                            bVar6 = local_238[(uint)uVar87 & 7];
                            local_238[(uint)uVar87 + 3 & 7] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                            *pbVar90 = (byte)(uVar74 / 3);
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar58;
                          } while (uVar95 != uVar87);
                          break;
                        case 4:
                          if (iVar80 < 0) goto LAB_00184287;
                          uVar87 = 0;
                          uVar74 = 0;
                          pbVar90 = pbVar98;
                          do {
                            bVar103 = *pbVar90;
                            uVar89 = (ulong)((uint)uVar87 & 7);
                            local_238[uVar89 ^ 4] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)(byte)local_238[uVar89]);
                            *pbVar90 = (byte)(uVar74 >> 2);
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar58;
                          } while (uVar95 != uVar87);
                          break;
                        case 5:
                          if (iVar80 < 0) goto LAB_00184287;
                          uVar87 = 0;
                          uVar74 = 0;
                          pbVar90 = pbVar98;
                          do {
                            bVar103 = *pbVar90;
                            bVar6 = local_238[(uint)uVar87 & 7];
                            local_238[(uint)uVar87 + 5 & 7] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                            *pbVar90 = (byte)(uVar74 / 5);
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar58;
                          } while (uVar95 != uVar87);
                          break;
                        default:
                          if (iVar80 < 0) goto LAB_00184287;
                          uVar87 = 0;
                          uVar74 = 0;
                          pbVar90 = pbVar98;
                          do {
                            bVar103 = *pbVar90;
                            bVar6 = local_238[(uint)uVar87 & 7];
                            local_238[uVar56 + (uint)uVar87 & 7] = bVar103;
                            uVar74 = uVar74 + ((uint)bVar103 - (uint)bVar6);
                            *pbVar90 = (byte)(uVar74 / uVar56);
                            uVar87 = uVar87 + 1;
                            pbVar90 = pbVar90 + lVar58;
                          } while (uVar95 != uVar87);
                        }
                        iVar93 = local_458._0_4_ - uVar134;
                        if (iVar93 != 0 && (int)uVar134 <= (int)local_458._0_4_) {
                          lVar77 = (long)(int)uVar134;
                          pbVar90 = pbVar98 + lVar58 * lVar77;
                          do {
                            if (*pbVar90 != 0) {
                              __assert_fail("pixels[i*stride_in_bytes] == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/stb_truetype.h"
                                            ,0xf5f,
                                            "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar74 = uVar74 - (byte)local_238[(uint)lVar77 & 7];
                            *pbVar90 = (byte)(uVar74 / uVar56);
                            lVar77 = lVar77 + 1;
                            pbVar90 = pbVar90 + lVar58;
                            iVar93 = iVar93 + -1;
                          } while (iVar93 != 0);
                        }
                        pbVar98 = pbVar98 + 1;
                        iVar76 = iVar76 + 1;
                      } while (iVar76 != local_468._0_4_);
                      sVar85 = *(short *)(local_438 + 8);
                      uVar48 = *(ushort *)(local_438 + 10);
                      uVar81 = (uint)*(ushort *)(local_438 + 4);
                      uVar49 = *(ushort *)(local_438 + 6);
                    }
                  }
                  *local_2a0 = sVar85;
                  local_2a0[1] = uVar48;
                  local_2a0[2] = sVar85 + (short)uVar81;
                  local_2a0[3] = uVar49 + uVar48;
                  *(float *)(local_2a0 + 8) =
                       (float)(int)(short)((short)(local_350 << 8) + (short)local_354) * local_308;
                  *(ulong *)(local_2a0 + 4) =
                       CONCAT44((float)local_34c * local_258._4_4_ + local_248._4_4_,
                                (float)(int)local_440 * local_258._0_4_ + local_248._0_4_);
                  *(float *)(local_2a0 + 10) =
                       (float)(int)(uVar81 + local_440) * local_258._0_4_ + local_248._0_4_;
                  *(float *)(local_2a0 + 0xc) =
                       (float)(int)((uint)uVar49 + local_34c) * (float)local_268._0_4_ +
                       (float)local_278._0_4_;
                  iVar76 = *(int *)(local_370 + 0x10);
                  lVar78 = local_298;
                  lVar77 = local_320;
                  lVar92 = local_368;
                  lVar101 = local_370;
                }
                lVar78 = lVar78 + 1;
                lVar92 = lVar92 + 1;
                lVar58 = local_2d8;
                lVar96 = local_2c8;
              } while (lVar92 < iVar76);
            }
            lVar96 = lVar96 + 1;
          } while (lVar96 != local_2d0);
        }
        local_3b8.h_oversample = (undefined4)local_288;
        local_3b8.v_oversample = local_288._4_4_;
        fVar110 = *(float *)(local_2f0->Name + local_2f8 + -4);
        if ((fVar110 != 1.0) || (NAN(fVar110))) {
          lVar58 = 0;
          auVar116 = _DAT_001b23c0;
          auVar121 = _DAT_001b23b0;
          auVar125 = _DAT_001b23a0;
          auVar127 = _DAT_001b2390;
          do {
            auVar112 = auVar121 & _DAT_001b23d0 | _DAT_001b23e0;
            uVar56 = auVar121._4_4_;
            uVar81 = auVar121._8_4_;
            uVar134 = auVar121._12_4_;
            auVar150 = auVar116 & _DAT_001b23d0 | _DAT_001b23e0;
            uVar74 = auVar116._4_4_;
            uVar141 = auVar116._8_4_;
            uVar142 = auVar116._12_4_;
            auVar161 = auVar127 & _DAT_001b23d0 | _DAT_001b23e0;
            uVar153 = auVar127._4_4_;
            uVar155 = auVar127._8_4_;
            uVar157 = auVar127._12_4_;
            auVar105 = auVar125 & _DAT_001b23d0 | _DAT_001b23e0;
            uVar167 = auVar125._4_4_;
            uVar169 = auVar125._8_4_;
            uVar171 = auVar125._12_4_;
            fVar160 = (((float)(auVar125._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar105._0_4_) * fVar110;
            fVar168 = (((float)(uVar167 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar105._4_4_) *
                      fVar110;
            fVar170 = (((float)(uVar169 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar105._8_4_) *
                      fVar110;
            fVar172 = (((float)(uVar171 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar105._12_4_) *
                      fVar110;
            fVar144 = (((float)(auVar127._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar161._0_4_) * fVar110;
            fVar154 = (((float)(uVar153 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar161._4_4_) *
                      fVar110;
            fVar156 = (((float)(uVar155 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar161._8_4_) *
                      fVar110;
            fVar158 = (((float)(uVar157 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar161._12_4_) *
                      fVar110;
            fVar123 = (((float)(auVar116._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar150._0_4_) * fVar110;
            fVar135 = (((float)(uVar74 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar150._4_4_) *
                      fVar110;
            fVar159 = (((float)(uVar141 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar150._8_4_) *
                      fVar110;
            fVar143 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar150._12_4_) *
                      fVar110;
            fVar128 = (((float)(auVar121._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar112._0_4_) * fVar110;
            fVar133 = (((float)(uVar56 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar112._4_4_) *
                      fVar110;
            fVar104 = (((float)(uVar81 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar112._8_4_) *
                      fVar110;
            fVar118 = (((float)(uVar134 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar112._12_4_) *
                      fVar110;
            auVar132._0_4_ = (int)fVar128;
            auVar132._4_4_ = (int)fVar133;
            auVar132._8_4_ = (int)fVar104;
            auVar132._12_4_ = (int)fVar118;
            auVar184._0_4_ = auVar132._0_4_ >> 0x1f;
            auVar184._4_4_ = auVar132._4_4_ >> 0x1f;
            auVar184._8_4_ = auVar132._8_4_ >> 0x1f;
            auVar184._12_4_ = auVar132._12_4_ >> 0x1f;
            fVar189 = (float)DAT_001b2410;
            fVar191 = DAT_001b2410._4_4_;
            fVar192 = DAT_001b2410._8_4_;
            fVar193 = DAT_001b2410._12_4_;
            auVar131._0_4_ = (int)(fVar128 - fVar189);
            auVar131._4_4_ = (int)(fVar133 - fVar191);
            auVar131._8_4_ = (int)(fVar104 - fVar192);
            auVar131._12_4_ = (int)(fVar118 - fVar193);
            auVar132 = auVar131 & auVar184 | auVar132;
            auVar139._0_4_ = (int)fVar123;
            auVar139._4_4_ = (int)fVar135;
            auVar139._8_4_ = (int)fVar159;
            auVar139._12_4_ = (int)fVar143;
            auVar185._0_4_ = auVar139._0_4_ >> 0x1f;
            auVar185._4_4_ = auVar139._4_4_ >> 0x1f;
            auVar185._8_4_ = auVar139._8_4_ >> 0x1f;
            auVar185._12_4_ = auVar139._12_4_ >> 0x1f;
            auVar138._0_4_ = (int)(fVar123 - fVar189);
            auVar138._4_4_ = (int)(fVar135 - fVar191);
            auVar138._8_4_ = (int)(fVar159 - fVar192);
            auVar138._12_4_ = (int)(fVar143 - fVar193);
            auVar139 = auVar138 & auVar185 | auVar139;
            auVar180._0_4_ = (int)fVar144;
            auVar180._4_4_ = (int)fVar154;
            auVar180._8_4_ = (int)fVar156;
            auVar180._12_4_ = (int)fVar158;
            auVar190._0_4_ = auVar180._0_4_ >> 0x1f;
            auVar190._4_4_ = auVar180._4_4_ >> 0x1f;
            auVar190._8_4_ = auVar180._8_4_ >> 0x1f;
            auVar190._12_4_ = auVar180._12_4_ >> 0x1f;
            auVar179._0_4_ = (int)(fVar144 - 2.1474836e+09);
            auVar179._4_4_ = (int)(fVar154 - 2.1474836e+09);
            auVar179._8_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar179._12_4_ = (int)(fVar158 - 2.1474836e+09);
            auVar180 = auVar179 & auVar190 | auVar180;
            auVar163._0_4_ = (int)fVar160;
            auVar163._4_4_ = (int)fVar168;
            auVar163._8_4_ = (int)fVar170;
            auVar163._12_4_ = (int)fVar172;
            auVar186._0_4_ = auVar163._0_4_ >> 0x1f;
            auVar186._4_4_ = auVar163._4_4_ >> 0x1f;
            auVar186._8_4_ = auVar163._8_4_ >> 0x1f;
            auVar186._12_4_ = auVar163._12_4_ >> 0x1f;
            auVar162._0_4_ = (int)(fVar160 - fVar189);
            auVar162._4_4_ = (int)(fVar168 - fVar191);
            auVar162._8_4_ = (int)(fVar170 - fVar192);
            auVar162._12_4_ = (int)(fVar172 - fVar193);
            auVar163 = auVar162 & auVar186 | auVar163;
            auVar187._8_4_ = 0x80000000;
            auVar187._0_8_ = 0x8000000080000000;
            auVar187._12_4_ = 0x80000000;
            auVar187 = auVar163 ^ auVar187;
            auVar151._0_4_ = -(uint)(auVar187._0_4_ < -0x7fffff01);
            auVar151._4_4_ = -(uint)(auVar187._4_4_ < -0x7fffff01);
            auVar151._8_4_ = -(uint)(auVar187._8_4_ < -0x7fffff01);
            auVar151._12_4_ = -(uint)(auVar187._12_4_ < -0x7fffff01);
            auVar112 = ~auVar151 & _DAT_001b2430 | auVar163 & auVar151;
            auVar164._8_4_ = 0x80000000;
            auVar164._0_8_ = 0x8000000080000000;
            auVar164._12_4_ = 0x80000000;
            auVar164 = auVar180 ^ auVar164;
            auVar188._0_4_ = -(uint)(auVar164._0_4_ < -0x7fffff01);
            auVar188._4_4_ = -(uint)(auVar164._4_4_ < -0x7fffff01);
            auVar188._8_4_ = -(uint)(auVar164._8_4_ < -0x7fffff01);
            auVar188._12_4_ = -(uint)(auVar164._12_4_ < -0x7fffff01);
            auVar150 = ~auVar188 & _DAT_001b2430 | auVar180 & auVar188;
            sVar85 = auVar112._0_2_;
            cVar13 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[0] - (0xff < sVar85);
            sVar85 = auVar112._2_2_;
            sVar50 = CONCAT11((0 < sVar85) * (sVar85 < 0x100) * auVar112[2] - (0xff < sVar85),cVar13
                             );
            sVar85 = auVar112._4_2_;
            cVar107 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[4] - (0xff < sVar85);
            sVar85 = auVar112._6_2_;
            uVar145 = CONCAT13((0 < sVar85) * (sVar85 < 0x100) * auVar112[6] - (0xff < sVar85),
                               CONCAT12(cVar107,sVar50));
            sVar85 = auVar112._8_2_;
            cVar14 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[8] - (0xff < sVar85);
            sVar85 = auVar112._10_2_;
            uVar146 = CONCAT15((0 < sVar85) * (sVar85 < 0x100) * auVar112[10] - (0xff < sVar85),
                               CONCAT14(cVar14,uVar145));
            sVar85 = auVar112._12_2_;
            cVar15 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[0xc] - (0xff < sVar85);
            sVar85 = auVar112._14_2_;
            uVar147 = CONCAT17((0 < sVar85) * (sVar85 < 0x100) * auVar112[0xe] - (0xff < sVar85),
                               CONCAT16(cVar15,uVar146));
            sVar85 = auVar150._0_2_;
            cVar16 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[0] - (0xff < sVar85);
            sVar85 = auVar150._2_2_;
            auVar148._0_10_ =
                 CONCAT19((0 < sVar85) * (sVar85 < 0x100) * auVar150[2] - (0xff < sVar85),
                          CONCAT18(cVar16,uVar147));
            sVar85 = auVar150._4_2_;
            cVar17 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[4] - (0xff < sVar85);
            auVar148[10] = cVar17;
            sVar85 = auVar150._6_2_;
            auVar148[0xb] = (0 < sVar85) * (sVar85 < 0x100) * auVar150[6] - (0xff < sVar85);
            sVar85 = auVar150._8_2_;
            cVar109 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[8] - (0xff < sVar85);
            auVar149[0xc] = cVar109;
            auVar149._0_12_ = auVar148;
            sVar85 = auVar150._10_2_;
            auVar149[0xd] = (0 < sVar85) * (sVar85 < 0x100) * auVar150[10] - (0xff < sVar85);
            sVar85 = auVar150._12_2_;
            cVar108 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[0xc] - (0xff < sVar85);
            auVar152[0xe] = cVar108;
            auVar152._0_14_ = auVar149;
            sVar85 = auVar150._14_2_;
            auVar152[0xf] = (0 < sVar85) * (sVar85 < 0x100) * auVar150[0xe] - (0xff < sVar85);
            auVar165._8_4_ = 0x80000000;
            auVar165._0_8_ = 0x8000000080000000;
            auVar165._12_4_ = 0x80000000;
            auVar165 = auVar139 ^ auVar165;
            auVar181._0_4_ = -(uint)(auVar165._0_4_ < -0x7fffff01);
            auVar181._4_4_ = -(uint)(auVar165._4_4_ < -0x7fffff01);
            auVar181._8_4_ = -(uint)(auVar165._8_4_ < -0x7fffff01);
            auVar181._12_4_ = -(uint)(auVar165._12_4_ < -0x7fffff01);
            auVar150 = ~auVar181 & _DAT_001b2430 | auVar139 & auVar181;
            auVar140._8_4_ = 0x80000000;
            auVar140._0_8_ = 0x8000000080000000;
            auVar140._12_4_ = 0x80000000;
            auVar140 = auVar132 ^ auVar140;
            auVar166._0_4_ = -(uint)(auVar140._0_4_ < -0x7fffff01);
            auVar166._4_4_ = -(uint)(auVar140._4_4_ < -0x7fffff01);
            auVar166._8_4_ = -(uint)(auVar140._8_4_ < -0x7fffff01);
            auVar166._12_4_ = -(uint)(auVar140._12_4_ < -0x7fffff01);
            auVar112 = ~auVar166 & _DAT_001b2430 | auVar132 & auVar166;
            sVar85 = auVar150._0_2_;
            cVar18 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[0] - (0xff < sVar85);
            sVar85 = auVar150._2_2_;
            sVar173 = CONCAT11((0 < sVar85) * (sVar85 < 0x100) * auVar150[2] - (0xff < sVar85),
                               cVar18);
            sVar85 = auVar150._4_2_;
            cVar19 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[4] - (0xff < sVar85);
            sVar85 = auVar150._6_2_;
            uVar174 = CONCAT13((0 < sVar85) * (sVar85 < 0x100) * auVar150[6] - (0xff < sVar85),
                               CONCAT12(cVar19,sVar173));
            sVar85 = auVar150._8_2_;
            cVar20 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[8] - (0xff < sVar85);
            sVar85 = auVar150._10_2_;
            uVar175 = CONCAT15((0 < sVar85) * (sVar85 < 0x100) * auVar150[10] - (0xff < sVar85),
                               CONCAT14(cVar20,uVar174));
            sVar85 = auVar150._12_2_;
            cVar21 = (0 < sVar85) * (sVar85 < 0x100) * auVar150[0xc] - (0xff < sVar85);
            sVar85 = auVar150._14_2_;
            uVar176 = CONCAT17((0 < sVar85) * (sVar85 < 0x100) * auVar150[0xe] - (0xff < sVar85),
                               CONCAT16(cVar21,uVar175));
            sVar85 = auVar112._0_2_;
            cVar22 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[0] - (0xff < sVar85);
            sVar85 = auVar112._2_2_;
            auVar177._0_10_ =
                 CONCAT19((0 < sVar85) * (sVar85 < 0x100) * auVar112[2] - (0xff < sVar85),
                          CONCAT18(cVar22,uVar176));
            sVar85 = auVar112._4_2_;
            cVar23 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[4] - (0xff < sVar85);
            auVar177[10] = cVar23;
            sVar85 = auVar112._6_2_;
            auVar177[0xb] = (0 < sVar85) * (sVar85 < 0x100) * auVar112[6] - (0xff < sVar85);
            sVar85 = auVar112._8_2_;
            cVar24 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[8] - (0xff < sVar85);
            auVar178[0xc] = cVar24;
            auVar178._0_12_ = auVar177;
            sVar85 = auVar112._10_2_;
            auVar178[0xd] = (0 < sVar85) * (sVar85 < 0x100) * auVar112[10] - (0xff < sVar85);
            sVar85 = auVar112._12_2_;
            cVar25 = (0 < sVar85) * (sVar85 < 0x100) * auVar112[0xc] - (0xff < sVar85);
            auVar182[0xe] = cVar25;
            auVar182._0_14_ = auVar178;
            sVar85 = auVar112._14_2_;
            auVar182[0xf] = (0 < sVar85) * (sVar85 < 0x100) * auVar112[0xe] - (0xff < sVar85);
            sVar85 = (short)((uint)uVar174 >> 0x10);
            auVar183[1] = (0 < sVar85) * (sVar85 < 0x100) * cVar19 - (0xff < sVar85);
            auVar183[0] = (0 < sVar173) * (sVar173 < 0x100) * cVar18 - (0xff < sVar173);
            sVar85 = (short)((uint6)uVar175 >> 0x20);
            auVar183[2] = (0 < sVar85) * (sVar85 < 0x100) * cVar20 - (0xff < sVar85);
            sVar85 = (short)((ulong)uVar176 >> 0x30);
            auVar183[3] = (0 < sVar85) * (sVar85 < 0x100) * cVar21 - (0xff < sVar85);
            sVar85 = (short)((unkuint10)auVar177._0_10_ >> 0x40);
            auVar183[4] = (0 < sVar85) * (sVar85 < 0x100) * cVar22 - (0xff < sVar85);
            sVar85 = auVar177._10_2_;
            auVar183[5] = (0 < sVar85) * (sVar85 < 0x100) * cVar23 - (0xff < sVar85);
            sVar85 = auVar178._12_2_;
            auVar183[6] = (0 < sVar85) * (sVar85 < 0x100) * cVar24 - (0xff < sVar85);
            sVar85 = auVar182._14_2_;
            auVar183[7] = (0 < sVar85) * (sVar85 < 0x100) * cVar25 - (0xff < sVar85);
            auVar183[8] = (0 < sVar50) * (sVar50 < 0x100) * cVar13 - (0xff < sVar50);
            sVar85 = (short)((uint)uVar145 >> 0x10);
            auVar183[9] = (0 < sVar85) * (sVar85 < 0x100) * cVar107 - (0xff < sVar85);
            sVar85 = (short)((uint6)uVar146 >> 0x20);
            auVar183[10] = (0 < sVar85) * (sVar85 < 0x100) * cVar14 - (0xff < sVar85);
            sVar85 = (short)((ulong)uVar147 >> 0x30);
            auVar183[0xb] = (0 < sVar85) * (sVar85 < 0x100) * cVar15 - (0xff < sVar85);
            sVar85 = (short)((unkuint10)auVar148._0_10_ >> 0x40);
            auVar183[0xc] = (0 < sVar85) * (sVar85 < 0x100) * cVar16 - (0xff < sVar85);
            sVar85 = auVar148._10_2_;
            auVar183[0xd] = (0 < sVar85) * (sVar85 < 0x100) * cVar17 - (0xff < sVar85);
            sVar85 = auVar149._12_2_;
            auVar183[0xe] = (0 < sVar85) * (sVar85 < 0x100) * cVar109 - (0xff < sVar85);
            sVar85 = auVar152._14_2_;
            auVar183[0xf] = (0 < sVar85) * (sVar85 < 0x100) * cVar108 - (0xff < sVar85);
            *(undefined1 (*) [16])(local_238 + lVar58) = auVar183;
            lVar58 = lVar58 + 0x10;
            iVar76 = (int)DAT_001b2440;
            auVar116._0_4_ = auVar116._0_4_ + iVar76;
            iVar80 = DAT_001b2440._4_4_;
            auVar116._4_4_ = uVar74 + iVar80;
            iVar93 = DAT_001b2440._8_4_;
            auVar116._8_4_ = uVar141 + iVar93;
            iVar57 = DAT_001b2440._12_4_;
            auVar116._12_4_ = uVar142 + iVar57;
            auVar121._0_4_ = auVar121._0_4_ + iVar76;
            auVar121._4_4_ = uVar56 + iVar80;
            auVar121._8_4_ = uVar81 + iVar93;
            auVar121._12_4_ = uVar134 + iVar57;
            auVar125._0_4_ = auVar125._0_4_ + iVar76;
            auVar125._4_4_ = uVar167 + iVar80;
            auVar125._8_4_ = uVar169 + iVar93;
            auVar125._12_4_ = uVar171 + iVar57;
            auVar127._0_4_ = auVar127._0_4_ + iVar76;
            auVar127._4_4_ = uVar153 + iVar80;
            auVar127._8_4_ = uVar155 + iVar93;
            auVar127._12_4_ = uVar157 + iVar57;
          } while (lVar58 != 0x100);
          iVar76 = *(int *)&local_410[1].data;
          if (iVar76 != 0) {
            pvVar63 = local_410[1].userdata;
            pvVar64 = pvVar63;
            do {
              if ((*(int *)((long)pvVar63 + 0xc) != 0) && (*(ushort *)((long)pvVar63 + 6) != 0)) {
                uVar48 = *(ushort *)((long)pvVar63 + 4);
                puVar65 = local_3b8.pixels +
                          (ulong)*(ushort *)((long)pvVar63 + 10) * (long)local_3b8.stride_in_bytes +
                          (ulong)*(ushort *)((long)pvVar63 + 8);
                uVar56 = (uint)*(ushort *)((long)pvVar63 + 6);
                do {
                  if ((ulong)uVar48 != 0) {
                    uVar75 = 0;
                    do {
                      puVar65[uVar75] = local_238[puVar65[uVar75]];
                      uVar75 = uVar75 + 1;
                    } while (uVar48 != uVar75);
                  }
                  puVar65 = puVar65 + local_3b8.stride_in_bytes;
                  bVar47 = 1 < (int)uVar56;
                  uVar56 = uVar56 - 1;
                } while (bVar47);
                pvVar64 = local_410[1].userdata;
                iVar76 = *(int *)&local_410[1].data;
              }
              pvVar63 = (void *)((long)pvVar63 + 0x10);
            } while (pvVar63 != (void *)((long)iVar76 * 0x10 + (long)pvVar64));
          }
        }
        local_410[1].userdata = (void *)0x0;
        lVar58 = local_2e8 + 1;
        psVar59 = (stbrp_context *)local_3b8.pack_info;
      } while (lVar58 < (atlas->ConfigData).Size);
    }
    ImGui::MemFree(local_3b8.nodes);
    ImGui::MemFree(psVar59);
    ImGui::MemFree(local_330);
    if (0 < (atlas->ConfigData).Size) {
      lVar58 = 0;
      local_428 = ZEXT816(0x1000100010001);
      do {
        pIVar12 = (atlas->ConfigData).Data;
        pIVar61 = pIVar12 + lVar58;
        pIVar9 = pIVar12[lVar58].DstFont;
        bVar103 = pIVar12[lVar58].MergeMode;
        if ((bool)bVar103 == true) {
          ImFont::BuildLookupTable(pIVar9);
          bVar103 = pIVar61->MergeMode;
        }
        local_468._0_8_ = local_418 + lVar58 * 0xc;
        if ((bVar103 & 1) == 0) {
          psVar60 = ((stbrp_node *)local_468._0_8_)->next;
          iVar76 = *(int *)&((stbrp_node *)(local_468._0_8_ + 0x20))->field_0x4;
          bVar103 = (&psVar60->field_0x7)[iVar76];
          fVar128 = pIVar61->SizePixels;
          uVar7 = (&psVar60->field_0x4)[iVar76];
          bVar6 = (&psVar60->field_0x5)[iVar76];
          uVar8 = (&psVar60->field_0x6)[iVar76];
          ImFont::ClearOutputData(pIVar9);
          pIVar9->FontSize = pIVar61->SizePixels;
          pIVar9->ConfigData = pIVar61;
          pIVar9->ContainerAtlas = atlas;
          auVar37._8_7_ = 0;
          auVar37._0_8_ = SUB158(ZEXT715(0) << 0x40,7);
          auVar26._10_6_ = 0;
          auVar26._0_10_ = SUB1510(auVar37 << 0x38,5);
          auVar36._1_12_ = SUB1612(auVar26 << 0x28,4);
          auVar36[0] = uVar8;
          auVar36[0xd] = 0;
          auVar40._1_14_ = auVar36 << 8;
          auVar40[0] = uVar7;
          auVar40[0xf] = 0;
          auVar112 = ZEXT416((uint)bVar103 << 0x10 | (uint)bVar6) | auVar40 << 8;
          sVar50 = auVar112._0_2_;
          sVar85 = auVar112._2_2_;
          fVar133 = (float)((int)sVar50 - (int)sVar85);
          fVar128 = fVar128 / fVar133;
          auVar122._0_2_ = -(ushort)(sVar50 < (short)local_428._0_2_);
          auVar122._2_2_ = -(ushort)(sVar50 < (short)local_428._2_2_);
          auVar122._4_2_ = -(ushort)(sVar85 < (short)local_428._4_2_);
          auVar122._6_2_ = -(ushort)(sVar85 < (short)local_428._6_2_);
          auVar122._8_2_ = -(ushort)(0 < (short)local_428._8_2_);
          auVar122._10_2_ = -(ushort)(0 < (short)local_428._10_2_);
          auVar122._12_2_ = -(ushort)(0 < (short)local_428._12_2_);
          auVar122._14_2_ = -(ushort)(0 < (short)local_428._14_2_);
          auVar112 = auVar122 & _DAT_001a7f40 | ~auVar122 & _DAT_001a6ab0;
          fVar110 = (float)(int)(fVar128 * (float)(int)sVar50 + auVar112._0_4_);
          fVar133 = (float)(int)(fVar128 * (float)(int)((long)CONCAT26(sVar85,CONCAT24((short)((uint
                                                  )fVar133 >> 0x10),fVar133)) >> 0x30) +
                                auVar112._4_4_);
          fVar104 = (float)(int)(fVar128 * 0.0 + auVar112._8_4_);
          fVar128 = (float)(int)(fVar128 * 0.0 + auVar112._12_4_);
          pIVar9->Ascent = fVar110;
          pIVar9->Descent = fVar133;
          psVar60 = (stbrp_node *)local_468._0_8_;
        }
        else {
          fVar110 = pIVar9->Ascent;
          fVar133 = 0.0;
          fVar104 = 0.0;
          fVar128 = 0.0;
          psVar60 = (stbrp_node *)local_468._0_8_;
        }
        pIVar9->ConfigDataCount = pIVar9->ConfigDataCount + 1;
        iVar76 = *(int *)&psVar60[0xb].next;
        if (0 < iVar76) {
          fVar118 = (pIVar61->GlyphOffset).x;
          local_458._4_4_ = (float)(int)fVar133;
          local_458._0_4_ = (float)(int)(fVar110 + 0.5) + (pIVar61->GlyphOffset).y;
          fStack_450 = (float)(int)fVar104;
          fStack_44c = (float)(int)fVar128;
          lVar77 = 0;
          do {
            iVar80 = *(int *)(*(long *)(psVar60 + 0xb) + 0x10 + lVar77 * 0x28);
            if (0 < iVar80) {
              lVar78 = *(long *)(psVar60 + 0xb) + lVar77 * 0x28;
              lVar101 = 0;
              lVar96 = 0;
              do {
                lVar92 = *(long *)(lVar78 + 0x18);
                if ((((*(ushort *)(lVar92 + lVar101) != 0) ||
                     (*(short *)(lVar92 + 4 + lVar101) != 0)) ||
                    (*(short *)(lVar92 + 2 + lVar101) != 0)) ||
                   (*(short *)(lVar92 + 6 + lVar101) != 0)) {
                  if (((pIVar61->MergeMode != true) ||
                      (uVar75 = lVar96 + (ulong)*(uint *)(lVar78 + 4) & 0xffff,
                      (pIVar9->IndexLookup).Size <= (int)uVar75)) ||
                     (((pIVar9->IndexLookup).Data[uVar75] == 0xffff ||
                      ((pIVar9->Glyphs).Data == (ImFontGlyph *)0x0)))) {
                    fVar128 = 1.0 / (float)atlas->TexHeight;
                    fVar110 = 1.0 / (float)atlas->TexWidth;
                    ImFont::AddGlyph(pIVar9,(short)*(uint *)(lVar78 + 4) + (short)lVar96,
                                     *(float *)(lVar92 + 8 + lVar101) + 0.0 + fVar118,
                                     *(float *)(lVar92 + 0xc + lVar101) + 0.0 + local_458._0_4_,
                                     *(float *)(lVar92 + 0x14 + lVar101) + 0.0 + fVar118,
                                     *(float *)(lVar92 + 0x18 + lVar101) + 0.0 + local_458._0_4_,
                                     (float)*(ushort *)(lVar92 + lVar101) * fVar110,
                                     (float)*(ushort *)(lVar92 + 2 + lVar101) * fVar128,
                                     (float)*(ushort *)(lVar92 + 4 + lVar101) * fVar110,
                                     (float)*(ushort *)(lVar92 + 6 + lVar101) * fVar128,
                                     *(float *)(lVar92 + 0x10 + lVar101));
                    iVar80 = *(int *)(lVar78 + 0x10);
                  }
                }
                lVar96 = lVar96 + 1;
                lVar101 = lVar101 + 0x1c;
              } while (lVar96 < iVar80);
              iVar76 = *(int *)&((stbrp_node *)(local_468._0_8_ + 0xb0))->next;
              psVar60 = (stbrp_node *)local_468._0_8_;
            }
            lVar77 = lVar77 + 1;
          } while (lVar77 < iVar76);
        }
        lVar58 = lVar58 + 1;
      } while (lVar58 < (atlas->ConfigData).Size);
    }
    ImGui::MemFree(local_338);
    ImGui::MemFree(local_380);
    ImGui::MemFree(local_418);
    ImFontAtlasBuildFinish(atlas);
    bVar47 = true;
  }
  return bVar47;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    atlas->TexID = NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Count glyphs/ranges
    int total_glyphs_count = 0;
    int total_ranges_count = 0;
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = atlas->GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, total_ranges_count++)
            total_glyphs_count += (in_range[1] - in_range[0]) + 1;
    }

    // We need a width for the skyline algorithm. Using a dumb heuristic here to decide of width. User can override TexDesiredWidth and TexGlyphPadding if they wish.
    // Width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    atlas->TexWidth = (atlas->TexDesiredWidth > 0) ? atlas->TexDesiredWidth : (total_glyphs_count > 4000) ? 4096 : (total_glyphs_count > 2000) ? 2048 : (total_glyphs_count > 1000) ? 1024 : 512;
    atlas->TexHeight = 0;

    // Start packing
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc = {};
    if (!stbtt_PackBegin(&spc, NULL, atlas->TexWidth, max_tex_height, 0, atlas->TexGlyphPadding, NULL))
        return false;
    stbtt_PackSetOversampling(&spc, 1, 1);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // Initialize font information (so we can error without any cleanup)
    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        int                 RectsCount;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)atlas->ConfigData.Size * sizeof(ImFontTempBuildData));
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            atlas->TexWidth = atlas->TexHeight = 0; // Reset output on failure
            ImGui::MemFree(tmp_array);
            return false;
        }
    }

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_ranges_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyphs_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyphs_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_ranges_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int font_glyphs_count = 0;
        int font_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, font_ranges_count++)
            font_glyphs_count += (in_range[1] - in_range[0]) + 1;
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = font_ranges_count;
        buf_ranges_n += font_ranges_count;
        for (int i = 0; i < font_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        tmp.RectsCount = font_glyphs_count;
        buf_rects_n += font_glyphs_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        IM_ASSERT(n == font_glyphs_count);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyphs_count);
    IM_ASSERT(buf_packedchars_n == total_glyphs_count);
    IM_ASSERT(buf_ranges_n == total_ranges_count);

    // Create texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // Second pass: render font characters
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            for (const stbrp_rect* r = tmp.Rects; r != tmp.Rects + tmp.RectsCount; r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, spc.pixels, r->x, r->y, r->w, r->h, spc.stride_in_bytes);
        }
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)
        if (cfg.MergeMode)
            dst_font->BuildLookupTable();

        const float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float off_x = cfg.GlyphOffset.x;
        const float off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyphNoFallback((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, atlas->TexWidth, atlas->TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);
                dst_font->AddGlyph((ImWchar)codepoint, q.x0 + off_x, q.y0 + off_y, q.x1 + off_x, q.y1 + off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
            }
        }
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    ImFontAtlasBuildFinish(atlas);

    return true;
}